

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

int all_tests(void)

{
  undefined8 uVar1;
  byte bVar2;
  char cVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  undefined4 uVar17;
  undefined8 uVar18;
  int *piVar19;
  long lVar20;
  long *plVar21;
  undefined8 *puVar22;
  FILE *pFVar23;
  ulong uVar24;
  undefined8 *puVar25;
  clock_t cVar26;
  clock_t cVar27;
  uint *puVar28;
  long lVar29;
  char *__ptr;
  void *pvVar30;
  void *__s2;
  uint *puVar31;
  int i_6;
  int i_8;
  uint uVar32;
  uint uVar33;
  uint *puVar34;
  uint8_t (*pauVar35) [20];
  uint8_t (*pauVar36) [20];
  int i;
  uint uVar37;
  int res;
  int iVar38;
  int j;
  int *piVar39;
  uint8_t *puVar40;
  int i_2;
  uint uVar41;
  bool bVar42;
  bool bVar43;
  byte bVar44;
  float fVar45;
  long local_51d8;
  int *local_51a0;
  uint8_t word [3];
  uint8_t expected2 [96];
  uint8_t words [6] [20];
  string_s head;
  uint8_t string [512];
  
  bVar44 = 0;
  tests_passed = tests_passed + 1;
  uVar18 = yatrie_new(500,500,200);
  yatrie_add(anon_var_dwarf_14b,0,uVar18);
  memset(string,0,0x1f8);
  yatrie_get_word_nodes(string,"",0,uVar18);
  bVar42 = string[0] != '\0';
  if (bVar42) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x2a9,"word_nodes.length == 0");
  }
  uVar32 = (uint)bVar42;
  if (string[1] != '\0') {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x2aa,"word_nodes.letters[0] == 0");
    uVar32 = uVar32 + 1;
  }
  if (string._104_4_ != 0) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x2ab,"word_nodes.nodes[0] == 0");
    uVar32 = uVar32 + 1;
  }
  memset(string,0,0x1f8);
  yatrie_get_word_nodes(string,anon_var_dwarf_1be,0,uVar18);
  if (string[0] != '\x01') {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x2af,"word_nodes.length == 1");
    uVar32 = uVar32 + 1;
  }
  if (string[1] != '\x01') {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x2b0,"word_nodes.letters[0] == 1");
    uVar32 = uVar32 + 1;
  }
  if (string._104_4_ != 1) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x2b1,"word_nodes.nodes[0] == 1");
    uVar32 = uVar32 + 1;
  }
  yatrie_add(anon_var_dwarf_1f6,0,uVar18);
  memset(string,0,0x1f8);
  yatrie_get_word_nodes(string,anon_var_dwarf_1be,0,uVar18);
  if (string[0] != '\x02') {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x2b6,"word_nodes.length == 2");
    uVar32 = uVar32 + 1;
  }
  if (string[1] != '\x01') {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x2b7,"word_nodes.letters[0] == 1");
    uVar32 = uVar32 + 1;
  }
  if (string[2] != '\x01') {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x2b8,"word_nodes.letters[1] == 1");
    uVar32 = uVar32 + 1;
  }
  if (string._104_4_ != 1) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x2b9,"word_nodes.nodes[0] == 1");
    uVar32 = uVar32 + 1;
  }
  if (string._108_4_ != 2) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x2ba,"word_nodes.nodes[1] == 2");
    uVar32 = uVar32 + 1;
  }
  yatrie_add(anon_var_dwarf_22e,0,uVar18);
  memset(string,0,0x1f8);
  yatrie_get_word_nodes(string,anon_var_dwarf_22e,0,uVar18);
  if (string[4] != '\x01') {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x2bf,"word_nodes.letters[3] == 1");
    uVar32 = uVar32 + 1;
  }
  if (string[5] != '\0') {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x2c0,"word_nodes.letters[4] == 0");
    uVar32 = 1;
  }
  iVar38 = 0;
  yatrie_get_id(anon_var_dwarf_22e,0,uVar18);
  yatrie_free(uVar18);
  uVar18 = yatrie_load("./../dic/suffix.trie");
  yatrie_get_id(anon_var_dwarf_266,0,uVar18);
  memset(string,0,0x1f8);
  yatrie_get_word_nodes(string,anon_var_dwarf_271,0,uVar18);
  piVar39 = &tests_passed;
  piVar19 = &tests_failed;
  if (uVar32 == 0) {
    piVar19 = &tests_passed;
  }
  *piVar19 = *piVar19 + 1;
  uVar18 = yatrie_new(1000,1000,1000);
  yatrie_free(uVar18);
  tests_passed = tests_passed + 1;
  lVar20 = yatrie_load("somethingoriginal.trie");
  if (lVar20 != 0) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x3bc,"yatrie_load(\"somethingoriginal.trie\") == NULL");
    piVar39 = &tests_failed;
  }
  *piVar39 = *piVar39 + 1;
  string[8] = 0xff;
  string[9] = 0xff;
  string[10] = 0xff;
  string[0xb] = 0xff;
  string[0] = 0xff;
  string[1] = 0xff;
  string[2] = 0xff;
  string[3] = 0xff;
  string[4] = 0xff;
  string[5] = 0xff;
  string[6] = 0xff;
  string[7] = 0xff;
  for (uVar32 = 1; uVar32 != 0x61; uVar32 = uVar32 + 1) {
    uVar41 = uVar32 & 0xff;
    uVar24 = 0;
    uVar33 = uVar32;
    while (uVar37 = (uint)uVar24, uVar37 != 0x60) {
      if (uVar37 <= uVar32) {
        bVar2 = bit_int32_count(string,uVar24 & 0xff,uVar41);
        if (uVar33 != bVar2) {
          bVar2 = bit_int32_count(string,uVar24 & 0xff,uVar41);
          printf("%d %d cnt: %d\n",uVar24,(ulong)uVar32,(ulong)bVar2);
        }
        bVar2 = bit_int32_count(string,uVar24 & 0xff,uVar41);
        if (uVar33 != bVar2) {
          printf("assert failed: %s:%i expression: %s\n",
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
                 ,0x6a,"bit_int32_count(mask, i, j) == j - i");
          iVar38 = iVar38 + 1;
        }
      }
      uVar33 = uVar33 - 1;
      uVar24 = (ulong)(uVar37 + 1);
    }
  }
  if (iVar38 == 0) {
    tests_passed = tests_passed + 1;
  }
  else {
    tests_failed = tests_failed + 1;
  }
  string[8] = 0xff;
  string[9] = 0xff;
  string[10] = 0xff;
  string[0xb] = 0xff;
  tests_passed = tests_passed + 4;
  string[0] = 0xff;
  string[1] = 0xff;
  string[2] = 0xff;
  string[3] = 0xff;
  string[4] = 0xff;
  string[5] = 0xff;
  string[6] = 0xff;
  string[7] = 0xff;
  iVar38 = 0;
  for (uVar32 = 1; uVar32 != 0x61; uVar32 = uVar32 + 1) {
    uVar41 = uVar32 & 0xff;
    uVar24 = 0;
    uVar33 = uVar32;
    while (uVar37 = (uint)uVar24, uVar37 != 0x60) {
      if (uVar37 <= uVar32) {
        bVar2 = bit_count(string,uVar24 & 0xff,uVar41);
        if (uVar33 != bVar2) {
          bVar2 = bit_count(string,uVar24 & 0xff,uVar41);
          printf("%d %d cnt: %d\n",uVar24,(ulong)uVar32,(ulong)bVar2);
        }
        bVar2 = bit_count(string,uVar24 & 0xff,uVar41);
        if (uVar33 != bVar2) {
          printf("assert failed: %s:%i expression: %s\n",
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
                 ,0x7e,"bit_count(mask, i, j) == j - i");
          iVar38 = iVar38 + 1;
        }
      }
      uVar33 = uVar33 - 1;
      uVar24 = (ulong)(uVar37 + 1);
    }
  }
  piVar19 = &tests_failed;
  local_51a0 = &tests_passed;
  if (iVar38 == 0) {
    piVar19 = &tests_passed;
  }
  *piVar19 = *piVar19 + 1;
  iVar38 = 0;
  for (lVar20 = 0; lVar20 != 8; lVar20 = lVar20 + 1) {
    cVar3 = char_bit_count((&DAT_001069eb)[lVar20],8);
    if (cVar3 != '\x01') {
      printf("assert failed: %s:%i expression: %s\n",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
             ,0x40,"count == 1");
      iVar38 = iVar38 + 1;
    }
  }
  for (lVar20 = 0; lVar20 != 8; lVar20 = lVar20 + 1) {
    cVar3 = char_bit_count((&DAT_001069f3)[lVar20],8);
    if (cVar3 != '\x02') {
      printf("assert failed: %s:%i expression: %s\n",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
             ,0x46,"count == 2");
      iVar38 = iVar38 + 1;
    }
  }
  for (lVar20 = 0; lVar20 != 4; lVar20 = lVar20 + 1) {
    cVar3 = char_bit_count((&DAT_00105008)[lVar20],8);
    if (cVar3 != '\x04') {
      printf("assert failed: %s:%i expression: %s\n",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
             ,0x4c,"count == 4");
      iVar38 = iVar38 + 1;
    }
  }
  for (bVar2 = 0; bVar2 != 9; bVar2 = bVar2 + 1) {
    bVar4 = char_bit_count(0xaa,bVar2);
    if (bVar4 != bVar2 >> 1) {
      printf("assert failed: %s:%i expression: %s\n",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
             ,0x52,"count == i / 2");
      iVar38 = iVar38 + 1;
    }
  }
  cVar3 = char_bit_count(4,2);
  if (cVar3 != '\0') {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x56,"char_bit_count(0b100, 2) == 0");
    iVar38 = iVar38 + 1;
  }
  piVar39 = &tests_failed;
  piVar19 = &tests_failed;
  if (iVar38 == 0) {
    piVar19 = &tests_passed;
  }
  *piVar19 = *piVar19 + 1;
  string[0] = '\0';
  string[1] = '\0';
  string[2] = '\0';
  string[3] = '\0';
  string[4] = '\0';
  string[5] = '\0';
  string[6] = '\0';
  string[7] = '\0';
  char_get_bits_raised(string,0xff);
  bVar42 = string._0_8_ != 0x807060504030201;
  if (bVar42) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x234,"memcmp(expected1, bits, 8) == 0");
  }
  string[0] = '\0';
  string[1] = '\0';
  string[2] = '\0';
  string[3] = '\0';
  string[4] = '\0';
  string[5] = '\0';
  string[6] = '\0';
  string[7] = '\0';
  char_get_bits_raised(string,1);
  bVar43 = string._0_8_ != 1;
  if (bVar43) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x238,"memcmp(expected2, bits, 8) == 0");
  }
  string[0] = '\0';
  string[1] = '\0';
  string[2] = '\0';
  string[3] = '\0';
  string[4] = '\0';
  string[5] = '\0';
  string[6] = '\0';
  string[7] = '\0';
  char_get_bits_raised(string,0x80);
  if (string._0_8_ == 8) {
    if (!bVar43 && !bVar42) {
      piVar39 = &tests_passed;
    }
  }
  else {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x23c,"memcmp(expected3, bits, 8) == 0");
  }
  *piVar39 = *piVar39 + 1;
  plVar21 = (long *)char_get_bits_raised_pre(0xff,0);
  cVar3 = *plVar21 != 0x807060504030201;
  if ((bool)cVar3) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x211,"memcmp(expected1, bits, 8) == 0");
  }
  plVar21 = (long *)char_get_bits_raised_pre(1,0);
  if (*plVar21 != 1) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x216,"memcmp(expected2, bits, 8) == 0");
    cVar3 = cVar3 + '\x01';
  }
  plVar21 = (long *)char_get_bits_raised_pre(0x80,0);
  if (*plVar21 != 8) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x21b,"memcmp(expected3, bits, 8) == 0");
    cVar3 = cVar3 + '\x01';
  }
  plVar21 = (long *)char_get_bits_raised_pre(0xaa,10);
  if (*plVar21 != 0x58565452) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x220,"memcmp(expected4, bits, 8) == 0");
    cVar3 = '\x01';
  }
  plVar21 = (long *)char_get_bits_raised_pre(0x81,0);
  if (*plVar21 == 0x801) {
    if (cVar3 == '\0') {
      piVar19 = &tests_passed;
      goto LAB_00101d74;
    }
  }
  else {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x225,"memcmp(expected5, bits, 8) == 0");
  }
  piVar19 = &tests_failed;
LAB_00101d74:
  *piVar19 = *piVar19 + 1;
  puVar22 = (undefined8 *)yatrie_new(5000000,5000000,300);
  uVar24 = 0;
  memset(string,0,0x200);
  pFVar23 = fopen((char *)dic_path,"r");
  if (pFVar23 == (FILE *)0x0) {
    local_51d8 = 0;
  }
  else {
    local_51d8 = clock();
    while( true ) {
      while( true ) {
        iVar38 = getc(pFVar23);
        if ((iVar38 != 10) && (iVar38 != 0xd)) break;
        uVar24 = 0;
        yatrie_add(string,0,puVar22);
        memset(string,0,0x200);
      }
      if (iVar38 == -1) break;
      string[(int)uVar24] = (uint8_t)iVar38;
      uVar24 = (ulong)((int)uVar24 + 1);
    }
    uVar24 = clock();
    fclose(pFVar23);
  }
  yatrie_save("/tmp/test.trie",puVar22);
  puVar25 = (undefined8 *)yatrie_load("/tmp/test.trie");
  cVar26 = clock();
  builtin_memcpy(words,"africa",7);
  iVar38 = 1000000;
  while (bVar42 = iVar38 != 0, iVar38 = iVar38 + -1, bVar42) {
    yatrie_get_id(words,0,puVar22);
  }
  cVar27 = clock();
  cVar3 = *(int *)*puVar22 != *(int *)*puVar25;
  if ((bool)cVar3) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x3f5,"trie->nodes->increment == trie2->nodes->increment");
  }
  if (*(int *)puVar22[1] != *(int *)puVar25[1]) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x3f6,"trie->refs->increment == trie2->refs->increment");
    cVar3 = cVar3 + '\x01';
  }
  if (*(long *)*puVar22 != *(long *)*puVar25) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x3f7,"memcmp(trie->nodes, trie2->nodes, sizeof(nodes_s)) == 0");
    cVar3 = cVar3 + '\x01';
  }
  if (*(long *)puVar22[1] != *(long *)puVar25[1]) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x3f8,"memcmp(trie->refs, trie2->refs, sizeof(refs_s)) == 0");
    cVar3 = '\x01';
  }
  printf("yatrie creation time: %fs\n",SUB84((double)((float)(long)(uVar24 - local_51d8) / 1e+06),0)
        );
  printf("yatrie search time 1 mln. rounds: %fs\n",
         SUB84((double)((float)(cVar27 - cVar26) / 1e+06),0));
  yatrie_free(puVar22);
  yatrie_free(puVar25);
  piVar19 = &tests_failed;
  if (cVar3 == '\0') {
    piVar19 = &tests_passed;
  }
  *piVar19 = *piVar19 + 1;
  puts(
      "TRIE NODE TRAVERSE TEST\nThis test will add a few words to the dictionary.\nThen it will try to traverse all nodes starting\nfrom the given one, gathering all the nodes with\nthe \"leaf\" flag into chains.\n"
      );
  uVar18 = yatrie_new(5000,5000,300);
  pauVar36 = words;
  puVar22 = &DAT_00106a00;
  pauVar35 = pauVar36;
  for (lVar20 = 0xf; lVar20 != 0; lVar20 = lVar20 + -1) {
    *(undefined8 *)*pauVar35 = *puVar22;
    puVar22 = puVar22 + (ulong)bVar44 * -2 + 1;
    pauVar35 = (uint8_t (*) [20])((long)pauVar35 + (ulong)bVar44 * -0x10 + 8);
  }
  for (lVar20 = 0; lVar20 != 0x78; lVar20 = lVar20 + 0x14) {
    uVar32 = yatrie_add(words[0] + lVar20,0,uVar18);
    printf("added word: %s with node id %d\n",words[0] + lVar20,(ulong)uVar32);
  }
  puVar28 = (uint *)calloc(1,0x2714);
  head.letters[0x4c] = '\0';
  head.letters[0x4d] = '\0';
  head.letters[0x4e] = '\0';
  head.letters[0x4f] = '\0';
  head.letters[0x50] = '\0';
  head.letters[0x51] = '\0';
  head.letters[0x52] = '\0';
  head.letters[0x53] = '\0';
  head.letters[0x54] = '\0';
  head.letters[0x55] = '\0';
  head.letters[0x56] = '\0';
  head.letters[0x57] = '\0';
  head.letters[0x58] = '\0';
  head.letters[0x59] = '\0';
  head.letters[0x5a] = '\0';
  head.letters[0x5b] = '\0';
  head.letters[0x3c] = '\0';
  head.letters[0x3d] = '\0';
  head.letters[0x3e] = '\0';
  head.letters[0x3f] = '\0';
  head.letters[0x40] = '\0';
  head.letters[0x41] = '\0';
  head.letters[0x42] = '\0';
  head.letters[0x43] = '\0';
  head.letters[0x44] = '\0';
  head.letters[0x45] = '\0';
  head.letters[0x46] = '\0';
  head.letters[0x47] = '\0';
  head.letters[0x48] = '\0';
  head.letters[0x49] = '\0';
  head.letters[0x4a] = '\0';
  head.letters[0x4b] = '\0';
  head.letters[0x2c] = '\0';
  head.letters[0x2d] = '\0';
  head.letters[0x2e] = '\0';
  head.letters[0x2f] = '\0';
  head.letters[0x30] = '\0';
  head.letters[0x31] = '\0';
  head.letters[0x32] = '\0';
  head.letters[0x33] = '\0';
  head.letters[0x34] = '\0';
  head.letters[0x35] = '\0';
  head.letters[0x36] = '\0';
  head.letters[0x37] = '\0';
  head.letters[0x38] = '\0';
  head.letters[0x39] = '\0';
  head.letters[0x3a] = '\0';
  head.letters[0x3b] = '\0';
  head.letters[0x1c] = '\0';
  head.letters[0x1d] = '\0';
  head.letters[0x1e] = '\0';
  head.letters[0x1f] = '\0';
  head.letters[0x20] = '\0';
  head.letters[0x21] = '\0';
  head.letters[0x22] = '\0';
  head.letters[0x23] = '\0';
  head.letters[0x24] = '\0';
  head.letters[0x25] = '\0';
  head.letters[0x26] = '\0';
  head.letters[0x27] = '\0';
  head.letters[0x28] = '\0';
  head.letters[0x29] = '\0';
  head.letters[0x2a] = '\0';
  head.letters[0x2b] = '\0';
  head.letters[0xc] = '\0';
  head.letters[0xd] = '\0';
  head.letters[0xe] = '\0';
  head.letters[0xf] = '\0';
  head.letters[0x10] = '\0';
  head.letters[0x11] = '\0';
  head.letters[0x12] = '\0';
  head.letters[0x13] = '\0';
  head.letters[0x14] = '\0';
  head.letters[0x15] = '\0';
  head.letters[0x16] = '\0';
  head.letters[0x17] = '\0';
  head.letters[0x18] = '\0';
  head.letters[0x19] = '\0';
  head.letters[0x1a] = '\0';
  head.letters[0x1b] = '\0';
  head.length._0_2_ = 0;
  head.length._2_1_ = 0;
  head.length._3_1_ = 0;
  head.letters[0] = '\0';
  head.letters[1] = '\0';
  head.letters[2] = '\0';
  head.letters[3] = '\0';
  head.letters[4] = '\0';
  head.letters[5] = '\0';
  head.letters[6] = '\0';
  head.letters[7] = '\0';
  head.letters[8] = '\0';
  head.letters[9] = '\0';
  head.letters[10] = '\0';
  head.letters[0xb] = '\0';
  head.letters[0x5c] = '\0';
  head.letters[0x5d] = '\0';
  head.letters[0x5e] = '\0';
  head.letters[0x5f] = '\0';
  head.letters[0x60] = '\0';
  head.letters[0x61] = '\0';
  head.letters[0x62] = '\0';
  head.letters[99] = '\0';
  yatrie_get_id(words + 5,0,uVar18);
  yatrie_node_traverse(puVar28,0,&head,uVar18);
  puts("\nTraverse root node completed\nCheck passed and returned words");
  puVar31 = puVar28 + 1;
  iVar38 = 0;
  for (uVar24 = 0; uVar24 < *puVar28; uVar24 = uVar24 + 1) {
    memset(string,0,0x100);
    decode_string(string,puVar31);
    printf("returned and decoded: %s expected: %s\n",string,pauVar36);
    iVar5 = bcmp(string,pauVar36,0x14);
    if (iVar5 != 0) {
      printf("assert failed: %s:%i expression: %s\n",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
             ,0x32d,"memcmp(dst, words[i], sizeof(words[i])) == 0");
      iVar38 = iVar38 + 1;
    }
    pauVar36 = pauVar36 + 1;
    puVar31 = puVar31 + 0x19;
  }
  puts("\n");
  yatrie_free(uVar18);
  free(puVar28);
  piVar39 = &tests_failed;
  piVar19 = &tests_failed;
  if (iVar38 == 0) {
    piVar19 = &tests_passed;
  }
  *piVar19 = *piVar19 + 1;
  builtin_memcpy(words,"\x02\x03\x04\x05\x06\a\b\t\n\v",0xb);
  memset(string,0,0x100);
  decode_string(string,words);
  iVar38 = bcmp(string,"0123456789",0xb);
  if (iVar38 == 0) {
    piVar39 = &tests_passed;
  }
  else {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x3b6,"memcmp(dst, \"0123456789\", sizeof(\"0123456789\")) == 0");
  }
  *piVar39 = *piVar39 + 1;
  plVar21 = (long *)yatrie_new(100,100,100);
  lVar20 = *plVar21;
  *(undefined4 *)(lVar20 + 8) = 1;
  iVar5 = node_insert_ref(7,0,lVar20 + 8,plVar21);
  iVar38 = *(int *)plVar21[1];
  if (iVar38 != 1) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xd0,"trie->refs->increment == 1");
  }
  uVar32 = (uint)(iVar38 != 1);
  if (*(int *)(*plVar21 + 8) != 0x41) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xd2,"trie->nodes->data[0].mask[0] == 0b1000001");
    uVar32 = uVar32 + 1;
  }
  lVar20 = plVar21[1];
  if (*(int *)(lVar20 + 8) != iVar5) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xd4,"trie->refs->data[0] == node_id_bit8");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  lVar29 = *plVar21;
  if (*(int *)(lVar20 + 8 + (ulong)*(uint *)(lVar29 + 0x14) * 4) != iVar5) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xd6,"trie->refs->data[trie->nodes->data[0].ref_id] == node_id_bit8");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
  }
  iVar38 = node_insert_ref(6,0,lVar29 + 8,plVar21);
  if (*(int *)plVar21[1] != 3) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xdb,"trie->refs->increment == 3");
    uVar32 = uVar32 + 1;
  }
  if (*(int *)(*plVar21 + 8) != 0x61) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xdd,"trie->nodes->data[0].mask[0] == 0b1100001");
    uVar32 = uVar32 + 1;
  }
  lVar20 = plVar21[1];
  if (*(int *)(lVar20 + 0xc) != iVar38) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xdf,"trie->refs->data[1] == node_id_bit7");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 0x10) != iVar5) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xe0,"trie->refs->data[2] == node_id_bit8");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  lVar29 = *plVar21;
  uVar33 = *(uint *)(lVar29 + 0x14);
  if (*(int *)(lVar20 + 8 + (ulong)uVar33 * 4) != iVar38) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xe2,"trie->refs->data[trie->nodes->data[0].ref_id] == node_id_bit7");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(lVar29 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 1) * 4) != iVar5) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xe3,"trie->refs->data[trie->nodes->data[0].ref_id + 1] == node_id_bit8");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
  }
  iVar6 = node_insert_ref(5,0,lVar29 + 8,plVar21);
  if (*(int *)plVar21[1] != 6) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xe8,"trie->refs->increment == 6");
    uVar32 = uVar32 + 1;
  }
  if (*(int *)(*plVar21 + 8) != 0x71) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xea,"trie->nodes->data[0].mask[0] == 0b1110001");
    uVar32 = uVar32 + 1;
  }
  lVar20 = plVar21[1];
  if (*(int *)(lVar20 + 0x14) != iVar6) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xec,"trie->refs->data[3] == node_id_bit6");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 0x18) != iVar38) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xed,"trie->refs->data[4] == node_id_bit7");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 0x1c) != iVar5) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xee,"trie->refs->data[5] == node_id_bit8");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  lVar29 = *plVar21;
  uVar33 = *(uint *)(lVar29 + 0x14);
  if (*(int *)(lVar20 + 8 + (ulong)uVar33 * 4) != iVar6) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xf0,"trie->refs->data[trie->nodes->data[0].ref_id] == node_id_bit6");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(lVar29 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 1) * 4) != iVar38) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xf1,"trie->refs->data[trie->nodes->data[0].ref_id + 1] == node_id_bit7");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(lVar29 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 2) * 4) != iVar5) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xf2,"trie->refs->data[trie->nodes->data[0].ref_id + 2] == node_id_bit8");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
  }
  iVar7 = node_insert_ref(2,0,lVar29 + 8,plVar21);
  if (*(int *)plVar21[1] != 10) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xf8,"trie->refs->increment == 10");
    uVar32 = uVar32 + 1;
  }
  if (*(int *)(*plVar21 + 8) != 0x73) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xfa,"trie->nodes->data[0].mask[0] == 0b1110011");
    uVar32 = uVar32 + 1;
  }
  lVar20 = plVar21[1];
  if (*(int *)(lVar20 + 0x20) != iVar7) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xfc,"trie->refs->data[6] == node_id_bit2");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 0x24) != iVar6) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xfd,"trie->refs->data[7] == node_id_bit6");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 0x28) != iVar38) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xfe,"trie->refs->data[8] == node_id_bit7");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 0x2c) != iVar5) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xff,"trie->refs->data[9] == node_id_bit8");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  lVar29 = *plVar21;
  uVar33 = *(uint *)(lVar29 + 0x14);
  if (*(int *)(lVar20 + 8 + (ulong)uVar33 * 4) != iVar7) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x101,"trie->refs->data[trie->nodes->data[0].ref_id] == node_id_bit2");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(lVar29 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 1) * 4) != iVar6) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x102,"trie->refs->data[trie->nodes->data[0].ref_id + 1] == node_id_bit6");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(lVar29 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 2) * 4) != iVar38) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x103,"trie->refs->data[trie->nodes->data[0].ref_id + 2] == node_id_bit7");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(lVar29 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 3) * 4) != iVar5) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x104,"trie->refs->data[trie->nodes->data[0].ref_id + 3] == node_id_bit8");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
  }
  iVar8 = node_insert_ref(3,1,lVar29 + 8,plVar21);
  if (*(int *)plVar21[1] != 0xf) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x109,"trie->refs->increment == 15");
    uVar32 = uVar32 + 1;
  }
  if (*(int *)(*plVar21 + 8) != 0x77) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x10b,"trie->nodes->data[0].mask[0] == 0b1110111");
    uVar32 = uVar32 + 1;
  }
  lVar20 = plVar21[1];
  if (*(int *)(lVar20 + 0x30) != iVar7) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x10d,"trie->refs->data[10] == node_id_bit2");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 0x34) != iVar8) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x10e,"trie->refs->data[11] == node_id_bit3");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 0x38) != iVar6) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x10f,"trie->refs->data[12] == node_id_bit6");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 0x3c) != iVar38) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x110,"trie->refs->data[13] == node_id_bit7");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 0x40) != iVar5) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x111,"trie->refs->data[14] == node_id_bit8");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  lVar29 = *plVar21;
  uVar33 = *(uint *)(lVar29 + 0x14);
  if (*(int *)(lVar20 + 8 + (ulong)uVar33 * 4) != iVar7) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x113,"trie->refs->data[trie->nodes->data[0].ref_id] == node_id_bit2");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(lVar29 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 1) * 4) != iVar8) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x114,"trie->refs->data[trie->nodes->data[0].ref_id + 1] == node_id_bit3");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(lVar29 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 2) * 4) != iVar6) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x115,"trie->refs->data[trie->nodes->data[0].ref_id + 2] == node_id_bit6");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(lVar29 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 3) * 4) != iVar38) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x116,"trie->refs->data[trie->nodes->data[0].ref_id + 3] == node_id_bit7");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(lVar29 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 4) * 4) != iVar5) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x117,"trie->refs->data[trie->nodes->data[0].ref_id + 4] == node_id_bit8");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
  }
  iVar9 = node_insert_ref(0x5e,5,lVar29 + 8,plVar21);
  if (*(int *)plVar21[1] != 0x15) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x11c,"trie->refs->increment == 21");
    uVar32 = uVar32 + 1;
  }
  lVar20 = *plVar21;
  if (*(int *)(lVar20 + 8) != 0x77) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x11e,"trie->nodes->data[0].mask[0] == 0b1110111");
    uVar32 = uVar32 + 1;
    lVar20 = *plVar21;
  }
  if (*(int *)(lVar20 + 0x10) != 0x20000000) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x11f,"trie->nodes->data[0].mask[2] == 0b100000000000000000000000000000");
    uVar32 = uVar32 + 1;
  }
  lVar20 = plVar21[1];
  if (*(int *)(lVar20 + 0x44) != iVar7) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x121,"trie->refs->data[15] == node_id_bit2");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 0x48) != iVar8) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x122,"trie->refs->data[16] == node_id_bit3");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 0x4c) != iVar6) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x123,"trie->refs->data[17] == node_id_bit6");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 0x50) != iVar38) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x124,"trie->refs->data[18] == node_id_bit7");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 0x54) != iVar5) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x125,"trie->refs->data[19] == node_id_bit8");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 0x58) != iVar9) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x126,"trie->refs->data[20] == node_id_bit94");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  lVar29 = *plVar21;
  uVar33 = *(uint *)(lVar29 + 0x14);
  if (*(int *)(lVar20 + 8 + (ulong)uVar33 * 4) != iVar7) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x128,"trie->refs->data[trie->nodes->data[0].ref_id] == node_id_bit2");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(lVar29 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 1) * 4) != iVar8) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x129,"trie->refs->data[trie->nodes->data[0].ref_id + 1] == node_id_bit3");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(lVar29 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 2) * 4) != iVar6) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x12a,"trie->refs->data[trie->nodes->data[0].ref_id + 2] == node_id_bit6");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(lVar29 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 3) * 4) != iVar38) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,299,"trie->refs->data[trie->nodes->data[0].ref_id + 3] == node_id_bit7");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(lVar29 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 4) * 4) != iVar5) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,300,"trie->refs->data[trie->nodes->data[0].ref_id + 4] == node_id_bit8");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(lVar29 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 5) * 4) != iVar9) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x12d,"trie->refs->data[trie->nodes->data[0].ref_id + 5] == node_id_bit94");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
  }
  iVar10 = node_insert_ref(0x21,5,lVar29 + 8,plVar21);
  if (*(int *)plVar21[1] != 0x1c) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x132,"trie->refs->increment == 28");
    uVar32 = uVar32 + 1;
  }
  lVar20 = *plVar21;
  if (*(int *)(lVar20 + 8) != 0x77) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x134,"trie->nodes->data[0].mask[0] == 0b1110111");
    uVar32 = uVar32 + 1;
    lVar20 = *plVar21;
  }
  if (*(int *)(lVar20 + 0x10) != 0x20000000) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x135,"trie->nodes->data[0].mask[2] == 0b100000000000000000000000000000");
    uVar32 = uVar32 + 1;
    lVar20 = *plVar21;
  }
  if (*(int *)(lVar20 + 0xc) != 1) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x136,"trie->nodes->data[0].mask[1] == 0b1");
    uVar32 = uVar32 + 1;
  }
  lVar20 = plVar21[1];
  if (*(int *)(lVar20 + 0x5c) != iVar7) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x138,"trie->refs->data[21] == node_id_bit2");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 0x60) != iVar8) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x139,"trie->refs->data[22] == node_id_bit3");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 100) != iVar6) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x13a,"trie->refs->data[23] == node_id_bit6");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 0x68) != iVar38) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x13b,"trie->refs->data[24] == node_id_bit7");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 0x6c) != iVar5) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x13c,"trie->refs->data[25] == node_id_bit8");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 0x70) != iVar10) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x13d,"trie->refs->data[26] == node_id_bit33");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 0x74) != iVar9) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x13e,"trie->refs->data[27] == node_id_bit94");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  uVar33 = *(uint *)(*plVar21 + 0x14);
  if (*(int *)(lVar20 + 8 + (ulong)uVar33 * 4) != iVar7) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x140,"trie->refs->data[trie->nodes->data[0].ref_id] == node_id_bit2");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 1) * 4) != iVar8) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x141,"trie->refs->data[trie->nodes->data[0].ref_id + 1] == node_id_bit3");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 2) * 4) != iVar6) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x142,"trie->refs->data[trie->nodes->data[0].ref_id + 2] == node_id_bit6");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 3) * 4) != iVar38) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x143,"trie->refs->data[trie->nodes->data[0].ref_id + 3] == node_id_bit7");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 4) * 4) != iVar5) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x144,"trie->refs->data[trie->nodes->data[0].ref_id + 4] == node_id_bit8");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 5) * 4) != iVar10) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x145,"trie->refs->data[trie->nodes->data[0].ref_id + 5] == node_id_bit33");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 6) * 4) != iVar9) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x146,"trie->refs->data[trie->nodes->data[0].ref_id + 6] == node_id_bit94");
    uVar32 = uVar32 + 1;
  }
  if (**(int **)(plVar21[2] + 0x10) != 1) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x14c,"trie->refs_free->data[1]->elements == 1");
    uVar32 = uVar32 + 1;
  }
  iVar11 = node_insert_ref(2,0,*plVar21 + 0x18,plVar21);
  if (**(int **)(plVar21[2] + 0x10) != 0) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x14e,"trie->refs_free->data[1]->elements == 0");
    uVar32 = uVar32 + 1;
  }
  if (*(int *)plVar21[1] != 0x1c) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x150,"trie->refs->increment == 28");
    uVar32 = uVar32 + 1;
  }
  lVar20 = *plVar21;
  if (*(int *)(lVar20 + 0x18) != 2) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x152,"trie->nodes->data[1].mask[0] == 0b10");
    uVar32 = uVar32 + 1;
    lVar20 = *plVar21;
  }
  if (*(int *)(plVar21[1] + 8 + (ulong)*(uint *)(lVar20 + 0x24) * 4) != iVar11) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x154,"trie->refs->data[trie->nodes->data[1].ref_id] == node8_bit2");
    uVar32 = uVar32 + 1;
  }
  if (**(int **)(plVar21[2] + 0x18) != 1) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x158,"trie->refs_free->data[2]->elements == 1");
    uVar32 = uVar32 + 1;
  }
  iVar12 = node_insert_ref(3,1,*plVar21 + 0x18,plVar21);
  lVar20 = plVar21[2];
  if (**(int **)(lVar20 + 0x10) != 1) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x15a,"trie->refs_free->data[1]->elements == 1");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[2];
  }
  if (**(int **)(lVar20 + 0x18) != 0) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x15b,"trie->refs_free->data[2]->elements == 0");
    uVar32 = uVar32 + 1;
  }
  if (*(int *)plVar21[1] != 0x1c) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x15d,"trie->refs->increment == 28");
    uVar32 = uVar32 + 1;
  }
  lVar20 = *plVar21;
  if (*(int *)(lVar20 + 0x18) != 6) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x15f,"trie->nodes->data[1].mask[0] == 0b110");
    uVar32 = uVar32 + 1;
    lVar20 = *plVar21;
  }
  lVar29 = plVar21[1];
  uVar33 = *(uint *)(lVar20 + 0x24);
  if (*(int *)(lVar29 + 8 + (ulong)uVar33 * 4) != iVar11) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x161,"trie->refs->data[trie->nodes->data[1].ref_id] == node8_bit2");
    uVar32 = uVar32 + 1;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x24);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 1) * 4) != iVar12) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x162,"trie->refs->data[trie->nodes->data[1].ref_id + 1] == node9_bit3");
    uVar32 = uVar32 + 1;
  }
  if (**(int **)(plVar21[2] + 0x20) != 1) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x166,"trie->refs_free->data[3]->elements == 1");
    uVar32 = uVar32 + 1;
  }
  iVar13 = node_insert_ref(4,2,*plVar21 + 0x18,plVar21);
  lVar20 = plVar21[2];
  if (**(int **)(lVar20 + 0x18) != 1) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x168,"trie->refs_free->data[2]->elements == 1");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[2];
  }
  if (**(int **)(lVar20 + 0x20) != 0) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x169,"trie->refs_free->data[3]->elements == 0");
    uVar32 = uVar32 + 1;
  }
  if (*(int *)plVar21[1] != 0x1c) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x16b,"trie->refs->increment == 28");
    uVar32 = uVar32 + 1;
  }
  lVar20 = *plVar21;
  if (*(int *)(lVar20 + 0x18) != 0xe) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x16d,"trie->nodes->data[1].mask[0] == 0b1110");
    uVar32 = uVar32 + 1;
    lVar20 = *plVar21;
  }
  lVar29 = plVar21[1];
  uVar33 = *(uint *)(lVar20 + 0x24);
  if (*(int *)(lVar29 + 8 + (ulong)uVar33 * 4) != iVar11) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x16f,"trie->refs->data[trie->nodes->data[1].ref_id] == node8_bit2");
    uVar32 = uVar32 + 1;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x24);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 1) * 4) != iVar12) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x170,"trie->refs->data[trie->nodes->data[1].ref_id + 1] == node9_bit3");
    uVar32 = uVar32 + 1;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x24);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 2) * 4) != iVar13) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x171,"trie->refs->data[trie->nodes->data[1].ref_id + 2] == node10_bit4");
    uVar32 = uVar32 + 1;
  }
  if (**(int **)(plVar21[2] + 0x28) != 1) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x175,"trie->refs_free->data[4]->elements == 1");
    uVar32 = uVar32 + 1;
  }
  iVar14 = node_insert_ref(5,3,*plVar21 + 0x18,plVar21);
  lVar20 = plVar21[2];
  if (**(int **)(lVar20 + 0x20) != 1) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x177,"trie->refs_free->data[3]->elements == 1");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[2];
  }
  if (**(int **)(lVar20 + 0x28) != 0) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x178,"trie->refs_free->data[4]->elements == 0");
    uVar32 = uVar32 + 1;
  }
  if (*(int *)plVar21[1] != 0x1c) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x17a,"trie->refs->increment == 28");
    uVar32 = uVar32 + 1;
  }
  lVar20 = *plVar21;
  if (*(int *)(lVar20 + 0x18) != 0x1e) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x17c,"trie->nodes->data[1].mask[0] == 0b11110");
    uVar32 = uVar32 + 1;
    lVar20 = *plVar21;
  }
  lVar29 = plVar21[1];
  uVar33 = *(uint *)(lVar20 + 0x24);
  if (*(int *)(lVar29 + 8 + (ulong)uVar33 * 4) != iVar11) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x17e,"trie->refs->data[trie->nodes->data[1].ref_id] == node8_bit2");
    uVar32 = uVar32 + 1;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x24);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 1) * 4) != iVar12) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x17f,"trie->refs->data[trie->nodes->data[1].ref_id + 1] == node9_bit3");
    uVar32 = uVar32 + 1;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x24);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 2) * 4) != iVar13) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x180,"trie->refs->data[trie->nodes->data[1].ref_id + 2] == node10_bit4");
    uVar32 = uVar32 + 1;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x24);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 3) * 4) != iVar14) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x181,"trie->refs->data[trie->nodes->data[1].ref_id + 3] == node11_bit5");
    uVar32 = uVar32 + 1;
  }
  if (**(int **)(plVar21[2] + 0x30) != 1) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x185,"trie->refs_free->data[5]->elements == 1");
    uVar32 = uVar32 + 1;
  }
  iVar15 = node_insert_ref(6,4,*plVar21 + 0x18,plVar21);
  lVar20 = plVar21[2];
  if (**(int **)(lVar20 + 0x28) != 1) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x187,"trie->refs_free->data[4]->elements == 1");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[2];
  }
  if (**(int **)(lVar20 + 0x30) != 0) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x188,"trie->refs_free->data[5]->elements == 0");
    uVar32 = uVar32 + 1;
  }
  if (*(int *)plVar21[1] != 0x1c) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x18a,"trie->refs->increment == 28");
    uVar32 = uVar32 + 1;
  }
  lVar20 = *plVar21;
  if (*(int *)(lVar20 + 0x18) != 0x3e) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x18c,"trie->nodes->data[1].mask[0] == 0b111110");
    uVar32 = uVar32 + 1;
    lVar20 = *plVar21;
  }
  lVar29 = plVar21[1];
  uVar33 = *(uint *)(lVar20 + 0x24);
  if (*(int *)(lVar29 + 8 + (ulong)uVar33 * 4) != iVar11) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x18e,"trie->refs->data[trie->nodes->data[1].ref_id] == node8_bit2");
    uVar32 = uVar32 + 1;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x24);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 1) * 4) != iVar12) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,399,"trie->refs->data[trie->nodes->data[1].ref_id + 1] == node9_bit3");
    uVar32 = uVar32 + 1;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x24);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 2) * 4) != iVar13) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,400,"trie->refs->data[trie->nodes->data[1].ref_id + 2] == node10_bit4");
    uVar32 = uVar32 + 1;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x24);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 3) * 4) != iVar14) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x191,"trie->refs->data[trie->nodes->data[1].ref_id + 3] == node11_bit5");
    uVar32 = uVar32 + 1;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x24);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 4) * 4) != iVar15) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x192,"trie->refs->data[trie->nodes->data[1].ref_id + 4] == node12_bit6");
    uVar32 = uVar32 + 1;
  }
  if (**(int **)(plVar21[2] + 0x38) != 1) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x196,"trie->refs_free->data[6]->elements == 1");
    uVar32 = uVar32 + 1;
  }
  iVar16 = node_insert_ref(7,5,*plVar21 + 0x18,plVar21);
  lVar20 = plVar21[2];
  if (**(int **)(lVar20 + 0x30) != 1) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x198,"trie->refs_free->data[5]->elements == 1");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[2];
  }
  if (**(int **)(lVar20 + 0x38) != 0) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x199,"trie->refs_free->data[6]->elements == 0");
    uVar32 = uVar32 + 1;
  }
  if (*(int *)plVar21[1] != 0x1c) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x19b,"trie->refs->increment == 28");
    uVar32 = uVar32 + 1;
  }
  lVar20 = *plVar21;
  if (*(int *)(lVar20 + 0x18) != 0x7e) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x19d,"trie->nodes->data[1].mask[0] == 0b1111110");
    uVar32 = uVar32 + 1;
    lVar20 = *plVar21;
  }
  lVar29 = plVar21[1];
  uVar33 = *(uint *)(lVar20 + 0x24);
  if (*(int *)(lVar29 + 8 + (ulong)uVar33 * 4) != iVar11) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x19f,"trie->refs->data[trie->nodes->data[1].ref_id] == node8_bit2");
    uVar32 = uVar32 + 1;
    lVar20 = *plVar21;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(lVar20 + 0x24);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 1) * 4) != iVar12) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x1a0,"trie->refs->data[trie->nodes->data[1].ref_id + 1] == node9_bit3");
    uVar32 = uVar32 + 1;
    lVar20 = *plVar21;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(lVar20 + 0x24);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 2) * 4) != iVar13) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x1a1,"trie->refs->data[trie->nodes->data[1].ref_id + 2] == node10_bit4");
    uVar32 = uVar32 + 1;
    lVar20 = *plVar21;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(lVar20 + 0x24);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 3) * 4) != iVar14) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x1a2,"trie->refs->data[trie->nodes->data[1].ref_id + 3] == node11_bit5");
    uVar32 = uVar32 + 1;
    lVar20 = *plVar21;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(lVar20 + 0x24);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 4) * 4) != iVar15) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x1a3,"trie->refs->data[trie->nodes->data[1].ref_id + 4] == node12_bit6");
    uVar32 = uVar32 + 1;
    lVar20 = *plVar21;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(lVar20 + 0x24);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 5) * 4) != iVar16) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x1a4,"trie->refs->data[trie->nodes->data[1].ref_id + 5] == node13_bit7");
    uVar32 = uVar32 + 1;
    lVar20 = *plVar21;
    lVar29 = plVar21[1];
  }
  uVar33 = *(uint *)(lVar20 + 0x14);
  if (*(int *)(lVar29 + 8 + (ulong)uVar33 * 4) != iVar7) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x1a8,"trie->refs->data[trie->nodes->data[0].ref_id] == node_id_bit2");
    uVar32 = uVar32 + 1;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x14);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 1) * 4) != iVar8) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x1a9,"trie->refs->data[trie->nodes->data[0].ref_id + 1] == node_id_bit3");
    uVar32 = uVar32 + 1;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x14);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 2) * 4) != iVar6) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x1aa,"trie->refs->data[trie->nodes->data[0].ref_id + 2] == node_id_bit6");
    uVar32 = uVar32 + 1;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x14);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 3) * 4) != iVar38) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x1ab,"trie->refs->data[trie->nodes->data[0].ref_id + 3] == node_id_bit7");
    uVar32 = uVar32 + 1;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x14);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 4) * 4) != iVar5) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x1ac,"trie->refs->data[trie->nodes->data[0].ref_id + 4] == node_id_bit8");
    uVar32 = uVar32 + 1;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x14);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 5) * 4) != iVar10) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x1ad,"trie->refs->data[trie->nodes->data[0].ref_id + 5] == node_id_bit33");
    uVar32 = uVar32 + 1;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x14);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 6) * 4) != iVar9) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x1ae,"trie->refs->data[trie->nodes->data[0].ref_id + 6] == node_id_bit94");
    uVar32 = 1;
  }
  yatrie_free(plVar21);
  piVar19 = &tests_failed;
  if (uVar32 == 0) {
    piVar19 = &tests_passed;
  }
  *piVar19 = *piVar19 + 1;
  uVar18 = yatrie_new(500,500,100);
  memcpy(string,&DAT_00106a80,0x480);
  for (lVar20 = 0; lVar20 != 0x480; lVar20 = lVar20 + 0x40) {
    yatrie_add(string + lVar20,0,uVar18);
  }
  iVar38 = 0;
  for (lVar20 = 0; lVar20 != 0x480; lVar20 = lVar20 + 0x40) {
    iVar5 = yatrie_get_id(string + lVar20,0,uVar18);
    if (iVar5 == 0) {
      printf("assert failed: %s:%i expression: %s\n",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
             ,0x35b,"nodes_ids[i] = yatrie_get_id(words[i], 0, trie)");
      iVar38 = iVar38 + 1;
    }
  }
  yatrie_free(uVar18);
  piVar39 = &tests_failed;
  piVar19 = &tests_failed;
  if (iVar38 == 0) {
    piVar19 = &tests_passed;
  }
  *piVar19 = *piVar19 + 1;
  uVar18 = yatrie_new(500,500,200);
  yatrie_add(anon_var_dwarf_8cd,0,uVar18);
  yatrie_add(anon_var_dwarf_8d9,0,uVar18);
  yatrie_add(anon_var_dwarf_8e5,0,uVar18);
  yatrie_add(anon_var_dwarf_8f1,0,uVar18);
  yatrie_add(anon_var_dwarf_8fd,0,uVar18);
  puVar28 = (uint *)calloc(1,0x2714);
  string[0x50] = '\0';
  string[0x51] = '\0';
  string[0x52] = '\0';
  string[0x53] = '\0';
  string[0x54] = '\0';
  string[0x55] = '\0';
  string[0x56] = '\0';
  string[0x57] = '\0';
  string[0x58] = '\0';
  string[0x59] = '\0';
  string[0x5a] = '\0';
  string[0x5b] = '\0';
  string[0x5c] = '\0';
  string[0x5d] = '\0';
  string[0x5e] = '\0';
  string[0x5f] = '\0';
  string[0x40] = '\0';
  string[0x41] = '\0';
  string[0x42] = '\0';
  string[0x43] = '\0';
  string[0x44] = '\0';
  string[0x45] = '\0';
  string[0x46] = '\0';
  string[0x47] = '\0';
  string[0x48] = '\0';
  string[0x49] = '\0';
  string[0x4a] = '\0';
  string[0x4b] = '\0';
  string[0x4c] = '\0';
  string[0x4d] = '\0';
  string[0x4e] = '\0';
  string[0x4f] = '\0';
  string[0x30] = '\0';
  string[0x31] = '\0';
  string[0x32] = '\0';
  string[0x33] = '\0';
  string[0x34] = '\0';
  string[0x35] = '\0';
  string[0x36] = '\0';
  string[0x37] = '\0';
  string[0x38] = '\0';
  string[0x39] = '\0';
  string[0x3a] = '\0';
  string[0x3b] = '\0';
  string[0x3c] = '\0';
  string[0x3d] = '\0';
  string[0x3e] = '\0';
  string[0x3f] = '\0';
  string[0x20] = '\0';
  string[0x21] = '\0';
  string[0x22] = '\0';
  string[0x23] = '\0';
  string[0x24] = '\0';
  string[0x25] = '\0';
  string[0x26] = '\0';
  string[0x27] = '\0';
  string[0x28] = '\0';
  string[0x29] = '\0';
  string[0x2a] = '\0';
  string[0x2b] = '\0';
  string[0x2c] = '\0';
  string[0x2d] = '\0';
  string[0x2e] = '\0';
  string[0x2f] = '\0';
  string[0x10] = '\0';
  string[0x11] = '\0';
  string[0x12] = '\0';
  string[0x13] = '\0';
  string[0x14] = '\0';
  string[0x15] = '\0';
  string[0x16] = '\0';
  string[0x17] = '\0';
  string[0x18] = '\0';
  string[0x19] = '\0';
  string[0x1a] = '\0';
  string[0x1b] = '\0';
  string[0x1c] = '\0';
  string[0x1d] = '\0';
  string[0x1e] = '\0';
  string[0x1f] = '\0';
  string[0] = '\0';
  string[1] = '\0';
  string[2] = '\0';
  string[3] = '\0';
  string[4] = '\0';
  string[5] = '\0';
  string[6] = '\0';
  string[7] = '\0';
  string[8] = '\0';
  string[9] = '\0';
  string[10] = '\0';
  string[0xb] = '\0';
  string[0xc] = '\0';
  string[0xd] = '\0';
  string[0xe] = '\0';
  string[0xf] = '\0';
  string[0x60] = '\0';
  string[0x61] = '\0';
  string[0x62] = '\0';
  string[99] = '\0';
  string[100] = '\0';
  string[0x65] = '\0';
  string[0x66] = '\0';
  string[0x67] = '\0';
  yatrie_node_traverse(puVar28,0,string,uVar18);
  puVar31 = puVar28 + 1;
  iVar38 = 0;
  for (uVar24 = 0; puVar34 = puVar31, uVar24 != *puVar28; uVar24 = uVar24 + 1) {
    for (; (char)*puVar34 != '\0'; puVar34 = (uint *)((long)puVar34 + 1)) {
      iVar38 = iVar38 + 1;
    }
    puVar31 = puVar31 + 0x19;
  }
  if (iVar38 == 0x1d) {
    yatrie_free(uVar18);
    free(puVar28);
    piVar39 = &tests_passed;
  }
  else {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x2f5,"length == expected_letters");
    yatrie_free(uVar18);
    free(puVar28);
  }
  *piVar39 = *piVar39 + 1;
  uVar18 = yatrie_new(9000,9000,9000);
  uVar24 = 0;
  memset(string,0,20000);
  memset(words,0,0x200);
  pFVar23 = fopen("./dic/english.txt","r");
  puVar40 = words[0];
  if (pFVar23 == (FILE *)0x0) {
    yatrie_free(uVar18);
    piVar19 = &tests_passed;
  }
  else {
    while( true ) {
      while ((iVar38 = getc(pFVar23), iVar38 == 0xd || (iVar38 == 10))) {
        uVar17 = yatrie_add(words,0,uVar18);
        *(undefined4 *)(string + uVar24 * 4) = uVar17;
        memset(words,0,0x200);
        uVar24 = (ulong)((int)uVar24 + 1);
        puVar40 = words[0];
      }
      if (iVar38 == -1) break;
      *puVar40 = (uint8_t)iVar38;
      puVar40 = puVar40 + 1;
    }
    rewind(pFVar23);
    iVar38 = 0;
    uVar24 = 0;
    puVar40 = words[0];
    while( true ) {
      while ((iVar5 = getc(pFVar23), iVar5 == 0xd || (iVar5 == 10))) {
        iVar5 = yatrie_get_id(words,0,uVar18);
        if (iVar5 != *(int *)(string + uVar24 * 4)) {
          printf("assert failed: %s:%i expression: %s\n",
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
                 ,0x1f1,"yatrie_get_id(string, 0, trie) == nodes_ids[i]");
          iVar38 = iVar38 + 1;
        }
        memset(words,0,0x200);
        uVar24 = (ulong)((int)uVar24 + 1);
        puVar40 = words[0];
      }
      if (iVar5 == -1) break;
      *puVar40 = (uint8_t)iVar5;
      puVar40 = puVar40 + 1;
    }
    fclose(pFVar23);
    yatrie_free(uVar18);
    piVar19 = &tests_failed;
    if (iVar38 == 0) {
      piVar19 = &tests_passed;
    }
  }
  *piVar19 = *piVar19 + 1;
  plVar21 = (long *)yatrie_new(500,500,100);
  lVar20 = *plVar21;
  *(undefined4 *)(lVar20 + 8) = 0x17;
  *(undefined4 *)(lVar20 + 0x14) = 0;
  builtin_memcpy(words,"\x01\x02\x03",4);
  words[0][4] = '\0';
  words[0][5] = '\0';
  words[0][6] = '\0';
  words[0][7] = '\0';
  words[0][8] = '\0';
  words[0][9] = '\0';
  words[0][10] = '\0';
  words[0][0xb] = '\0';
  words[0][0xc] = '\0';
  words[0][0xd] = '\0';
  words[0][0xe] = '\0';
  words[0][0xf] = '\0';
  words[4][0] = '\0';
  words[4][1] = '\0';
  words[4][2] = '\0';
  words[4][3] = '\0';
  words[4][4] = '\0';
  words[4][5] = '\0';
  words[4][6] = '\0';
  words[4][7] = '\0';
  words[4][8] = '\0';
  words[4][9] = '\0';
  words[4][10] = '\0';
  words[4][0xb] = '\0';
  words[4][0xc] = '\0';
  words[4][0xd] = '\0';
  words[4][0xe] = '\0';
  words[4][0xf] = '\0';
  words[3][4] = '\0';
  words[3][5] = '\0';
  words[3][6] = '\0';
  words[3][7] = '\0';
  words[3][8] = '\0';
  words[3][9] = '\0';
  words[3][10] = '\0';
  words[3][0xb] = '\0';
  words[3][0xc] = '\0';
  words[3][0xd] = '\0';
  words[3][0xe] = '\0';
  words[3][0xf] = '\0';
  words[3][0x10] = '\0';
  words[3][0x11] = '\0';
  words[3][0x12] = '\0';
  words[3][0x13] = '\0';
  words[2][8] = '\0';
  words[2][9] = '\0';
  words[2][10] = '\0';
  words[2][0xb] = '\0';
  words[2][0xc] = '\0';
  words[2][0xd] = '\0';
  words[2][0xe] = '\0';
  words[2][0xf] = '\0';
  words[2][0x10] = '\0';
  words[2][0x11] = '\0';
  words[2][0x12] = '\0';
  words[2][0x13] = '\0';
  words[3][0] = '\0';
  words[3][1] = '\0';
  words[3][2] = '\0';
  words[3][3] = '\0';
  words[1][0xc] = '\0';
  words[1][0xd] = '\0';
  words[1][0xe] = '\0';
  words[1][0xf] = '\0';
  words[1][0x10] = '\0';
  words[1][0x11] = '\0';
  words[1][0x12] = '\0';
  words[1][0x13] = '\0';
  words[2][0] = '\0';
  words[2][1] = '\0';
  words[2][2] = '\0';
  words[2][3] = '\0';
  words[2][4] = '\0';
  words[2][5] = '\0';
  words[2][6] = '\0';
  words[2][7] = '\0';
  words[0][0x10] = '\0';
  words[0][0x11] = '\0';
  words[0][0x12] = '\0';
  words[0][0x13] = '\0';
  words[1][0] = '\0';
  words[1][1] = '\0';
  words[1][2] = '\0';
  words[1][3] = '\0';
  words[1][4] = '\0';
  words[1][5] = '\0';
  words[1][6] = '\0';
  words[1][7] = '\0';
  words[1][8] = '\0';
  words[1][9] = '\0';
  words[1][10] = '\0';
  words[1][0xb] = '\0';
  memset(string,0,0x180);
  string[0] = 'W';
  string[1] = '\x04';
  string[2] = '\0';
  string[3] = '\0';
  string[4] = 0xae;
  string[5] = '\b';
  string[6] = '\0';
  string[7] = '\0';
  string[8] = '\x05';
  string[9] = '\r';
  string[10] = '\0';
  string[0xb] = '\0';
  lVar20 = plVar21[1];
  *(undefined8 *)(lVar20 + 8) = 0x8ae00000457;
  *(undefined4 *)(lVar20 + 0x10) = 0xd05;
  __ptr = (char *)calloc(1,0x1e4);
  yatrie_node_get_children(__ptr,0,plVar21);
  cVar3 = *__ptr != '\x03';
  if ((bool)cVar3) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x295,"children->length == 3");
  }
  iVar38 = bcmp(__ptr + 1,words,3);
  if (iVar38 != 0) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x296,"memcmp(children->letters, expected11, 3) == 0");
    cVar3 = cVar3 + '\x01';
  }
  iVar38 = bcmp(__ptr + 100,string,0xc);
  if (iVar38 != 0) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x297,"memcmp(children->nodes, expected12, 3 << REF_SIZE_POWER) == 0");
    cVar3 = '\x01';
  }
  yatrie_free(plVar21);
  free(__ptr);
  piVar39 = &tests_failed;
  piVar19 = &tests_failed;
  if (cVar3 == '\0') {
    piVar19 = &tests_passed;
  }
  *piVar19 = *piVar19 + 1;
  head.length._3_1_ = 0;
  head.letters[0] = '\0';
  head.letters[1] = '\0';
  head.letters[2] = '\0';
  head.letters[3] = '\0';
  head.letters[4] = '\0';
  head.letters[5] = '\0';
  head.letters[6] = '\0';
  head.letters[7] = '\0';
  head.letters[8] = '\0';
  head.letters[9] = '\0';
  head.letters[10] = '\0';
  head.letters[0xb] = '\0';
  head.letters[0x4c] = '\0';
  head.letters[0x4d] = '\0';
  head.letters[0x4e] = '\0';
  head.letters[0x4f] = '\0';
  head.letters[0x50] = '\0';
  head.letters[0x51] = '\0';
  head.letters[0x52] = '\0';
  head.letters[0x53] = '\0';
  head.letters[0x54] = '\0';
  head.letters[0x55] = '\0';
  head.letters[0x56] = '\0';
  head.letters[0x57] = '\0';
  head.letters[0x58] = '\0';
  head.letters[0x59] = '\0';
  head.letters[0x5a] = '\0';
  head.letters[0x5b] = '\0';
  head.letters[0x3c] = '\0';
  head.letters[0x3d] = '\0';
  head.letters[0x3e] = '\0';
  head.letters[0x3f] = '\0';
  head.letters[0x40] = '\0';
  head.letters[0x41] = '\0';
  head.letters[0x42] = '\0';
  head.letters[0x43] = '\0';
  head.letters[0x44] = '\0';
  head.letters[0x45] = '\0';
  head.letters[0x46] = '\0';
  head.letters[0x47] = '\0';
  head.letters[0x48] = '\0';
  head.letters[0x49] = '\0';
  head.letters[0x4a] = '\0';
  head.letters[0x4b] = '\0';
  head.letters[0x2c] = '\0';
  head.letters[0x2d] = '\0';
  head.letters[0x2e] = '\0';
  head.letters[0x2f] = '\0';
  head.letters[0x30] = '\0';
  head.letters[0x31] = '\0';
  head.letters[0x32] = '\0';
  head.letters[0x33] = '\0';
  head.letters[0x34] = '\0';
  head.letters[0x35] = '\0';
  head.letters[0x36] = '\0';
  head.letters[0x37] = '\0';
  head.letters[0x38] = '\0';
  head.letters[0x39] = '\0';
  head.letters[0x3a] = '\0';
  head.letters[0x3b] = '\0';
  head.letters[0x1c] = '\0';
  head.letters[0x1d] = '\0';
  head.letters[0x1e] = '\0';
  head.letters[0x1f] = '\0';
  head.letters[0x20] = '\0';
  head.letters[0x21] = '\0';
  head.letters[0x22] = '\0';
  head.letters[0x23] = '\0';
  head.letters[0x24] = '\0';
  head.letters[0x25] = '\0';
  head.letters[0x26] = '\0';
  head.letters[0x27] = '\0';
  head.letters[0x28] = '\0';
  head.letters[0x29] = '\0';
  head.letters[0x2a] = '\0';
  head.letters[0x2b] = '\0';
  head.letters[0xc] = '\0';
  head.letters[0xd] = '\0';
  head.letters[0xe] = '\0';
  head.letters[0xf] = '\0';
  head.letters[0x10] = '\0';
  head.letters[0x11] = '\0';
  head.letters[0x12] = '\0';
  head.letters[0x13] = '\0';
  head.letters[0x14] = '\0';
  head.letters[0x15] = '\0';
  head.letters[0x16] = '\0';
  head.letters[0x17] = '\0';
  head.letters[0x18] = '\0';
  head.letters[0x19] = '\0';
  head.letters[0x1a] = '\0';
  head.letters[0x1b] = '\0';
  head.length._0_2_ = 0x201;
  head.length._2_1_ = 3;
  expected2[8] = '\0';
  expected2[9] = '\0';
  expected2[10] = '\0';
  expected2[0xb] = '\0';
  expected2[0xc] = '\0';
  expected2[0xd] = '\0';
  expected2[0xe] = '\0';
  expected2[0xf] = '\0';
  expected2[0x50] = '\0';
  expected2[0x51] = '\0';
  expected2[0x52] = '\0';
  expected2[0x53] = '\0';
  expected2[0x54] = '\0';
  expected2[0x55] = '\0';
  expected2[0x56] = '\0';
  expected2[0x57] = '\0';
  expected2[0x58] = '\0';
  expected2[0x59] = '\0';
  expected2[0x5a] = '\0';
  expected2[0x5b] = '\0';
  expected2[0x5c] = '\0';
  expected2[0x5d] = '\0';
  expected2[0x5e] = '\0';
  expected2[0x5f] = '\0';
  expected2[0x40] = '\0';
  expected2[0x41] = '\0';
  expected2[0x42] = '\0';
  expected2[0x43] = '\0';
  expected2[0x44] = '\0';
  expected2[0x45] = '\0';
  expected2[0x46] = '\0';
  expected2[0x47] = '\0';
  expected2[0x48] = '\0';
  expected2[0x49] = '\0';
  expected2[0x4a] = '\0';
  expected2[0x4b] = '\0';
  expected2[0x4c] = '\0';
  expected2[0x4d] = '\0';
  expected2[0x4e] = '\0';
  expected2[0x4f] = '\0';
  expected2[0x30] = '\0';
  expected2[0x31] = '\0';
  expected2[0x32] = '\0';
  expected2[0x33] = '\0';
  expected2[0x34] = '\0';
  expected2[0x35] = '\0';
  expected2[0x36] = '\0';
  expected2[0x37] = '\0';
  expected2[0x38] = '\0';
  expected2[0x39] = '\0';
  expected2[0x3a] = '\0';
  expected2[0x3b] = '\0';
  expected2[0x3c] = '\0';
  expected2[0x3d] = '\0';
  expected2[0x3e] = '\0';
  expected2[0x3f] = '\0';
  expected2[0x20] = '\0';
  expected2[0x21] = '\0';
  expected2[0x22] = '\0';
  expected2[0x23] = '\0';
  expected2[0x24] = '\0';
  expected2[0x25] = '\0';
  expected2[0x26] = '\0';
  expected2[0x27] = '\0';
  expected2[0x28] = '\0';
  expected2[0x29] = '\0';
  expected2[0x2a] = '\0';
  expected2[0x2b] = '\0';
  expected2[0x2c] = '\0';
  expected2[0x2d] = '\0';
  expected2[0x2e] = '\0';
  expected2[0x2f] = '\0';
  expected2[0x10] = '\0';
  expected2[0x11] = '\0';
  expected2[0x12] = '\0';
  expected2[0x13] = '\0';
  expected2[0x14] = '\0';
  expected2[0x15] = '\0';
  expected2[0x16] = '\0';
  expected2[0x17] = '\0';
  expected2[0x18] = '\0';
  expected2[0x19] = '\0';
  expected2[0x1a] = '\0';
  expected2[0x1b] = '\0';
  expected2[0x1c] = '\0';
  expected2[0x1d] = '\0';
  expected2[0x1e] = '\0';
  expected2[0x1f] = '\0';
  builtin_memcpy(expected2,"\n\x14\x1e",4);
  expected2[4] = '\0';
  expected2[5] = '\0';
  expected2[6] = '\0';
  expected2[7] = '\0';
  _word = 0x21160b;
  string[0x50] = '\0';
  string[0x51] = '\0';
  string[0x52] = '\0';
  string[0x53] = '\0';
  string[0x54] = '\0';
  string[0x55] = '\0';
  string[0x56] = '\0';
  string[0x57] = '\0';
  string[0x58] = '\0';
  string[0x59] = '\0';
  string[0x5a] = '\0';
  string[0x5b] = '\0';
  string[0x5c] = '\0';
  string[0x5d] = '\0';
  string[0x5e] = '\0';
  string[0x5f] = '\0';
  string[0x40] = '\0';
  string[0x41] = '\0';
  string[0x42] = '\0';
  string[0x43] = '\0';
  string[0x44] = '\0';
  string[0x45] = '\0';
  string[0x46] = '\0';
  string[0x47] = '\0';
  string[0x48] = '\0';
  string[0x49] = '\0';
  string[0x4a] = '\0';
  string[0x4b] = '\0';
  string[0x4c] = '\0';
  string[0x4d] = '\0';
  string[0x4e] = '\0';
  string[0x4f] = '\0';
  string[0x30] = '\0';
  string[0x31] = '\0';
  string[0x32] = '\0';
  string[0x33] = '\0';
  string[0x34] = '\0';
  string[0x35] = '\0';
  string[0x36] = '\0';
  string[0x37] = '\0';
  string[0x38] = '\0';
  string[0x39] = '\0';
  string[0x3a] = '\0';
  string[0x3b] = '\0';
  string[0x3c] = '\0';
  string[0x3d] = '\0';
  string[0x3e] = '\0';
  string[0x3f] = '\0';
  string[0x20] = '\0';
  string[0x21] = '\0';
  string[0x22] = '\0';
  string[0x23] = '\0';
  string[0x24] = '\0';
  string[0x25] = '\0';
  string[0x26] = '\0';
  string[0x27] = '\0';
  string[0x28] = '\0';
  string[0x29] = '\0';
  string[0x2a] = '\0';
  string[0x2b] = '\0';
  string[0x2c] = '\0';
  string[0x2d] = '\0';
  string[0x2e] = '\0';
  string[0x2f] = '\0';
  string[0x10] = '\0';
  string[0x11] = '\0';
  string[0x12] = '\0';
  string[0x13] = '\0';
  string[0x14] = '\0';
  string[0x15] = '\0';
  string[0x16] = '\0';
  string[0x17] = '\0';
  string[0x18] = '\0';
  string[0x19] = '\0';
  string[0x1a] = '\0';
  string[0x1b] = '\0';
  string[0x1c] = '\0';
  string[0x1d] = '\0';
  string[0x1e] = '\0';
  string[0x1f] = '\0';
  string[8] = '\0';
  string[9] = '\0';
  string[10] = '\0';
  string[0xb] = '\0';
  string[0xc] = '\0';
  string[0xd] = '\0';
  string[0xe] = '\0';
  string[0xf] = '\0';
  words[4][0] = '\0';
  words[4][1] = '\0';
  words[4][2] = '\0';
  words[4][3] = '\0';
  words[4][4] = '\0';
  words[4][5] = '\0';
  words[4][6] = '\0';
  words[4][7] = '\0';
  words[4][8] = '\0';
  words[4][9] = '\0';
  words[4][10] = '\0';
  words[4][0xb] = '\0';
  words[4][0xc] = '\0';
  words[4][0xd] = '\0';
  words[4][0xe] = '\0';
  words[4][0xf] = '\0';
  words[3][4] = '\0';
  words[3][5] = '\0';
  words[3][6] = '\0';
  words[3][7] = '\0';
  words[3][8] = '\0';
  words[3][9] = '\0';
  words[3][10] = '\0';
  words[3][0xb] = '\0';
  words[3][0xc] = '\0';
  words[3][0xd] = '\0';
  words[3][0xe] = '\0';
  words[3][0xf] = '\0';
  words[3][0x10] = '\0';
  words[3][0x11] = '\0';
  words[3][0x12] = '\0';
  words[3][0x13] = '\0';
  words[2][8] = '\0';
  words[2][9] = '\0';
  words[2][10] = '\0';
  words[2][0xb] = '\0';
  words[2][0xc] = '\0';
  words[2][0xd] = '\0';
  words[2][0xe] = '\0';
  words[2][0xf] = '\0';
  words[2][0x10] = '\0';
  words[2][0x11] = '\0';
  words[2][0x12] = '\0';
  words[2][0x13] = '\0';
  words[3][0] = '\0';
  words[3][1] = '\0';
  words[3][2] = '\0';
  words[3][3] = '\0';
  words[1][0xc] = '\0';
  words[1][0xd] = '\0';
  words[1][0xe] = '\0';
  words[1][0xf] = '\0';
  words[1][0x10] = '\0';
  words[1][0x11] = '\0';
  words[1][0x12] = '\0';
  words[1][0x13] = '\0';
  words[2][0] = '\0';
  words[2][1] = '\0';
  words[2][2] = '\0';
  words[2][3] = '\0';
  words[2][4] = '\0';
  words[2][5] = '\0';
  words[2][6] = '\0';
  words[2][7] = '\0';
  words[0][0x10] = '\0';
  words[0][0x11] = '\0';
  words[0][0x12] = '\0';
  words[0][0x13] = '\0';
  words[1][0] = '\0';
  words[1][1] = '\0';
  words[1][2] = '\0';
  words[1][3] = '\0';
  words[1][4] = '\0';
  words[1][5] = '\0';
  words[1][6] = '\0';
  words[1][7] = '\0';
  words[1][8] = '\0';
  words[1][9] = '\0';
  words[1][10] = '\0';
  words[1][0xb] = '\0';
  words[0][0] = '\0';
  words[0][1] = '\0';
  words[0][2] = '\0';
  words[0][3] = '\0';
  words[0][4] = '\0';
  words[0][5] = '\0';
  words[0][6] = '\0';
  words[0][7] = '\0';
  words[0][8] = '\0';
  words[0][9] = '\0';
  words[0][10] = '\0';
  words[0][0xb] = '\0';
  words[0][0xc] = '\0';
  words[0][0xd] = '\0';
  words[0][0xe] = '\0';
  words[0][0xf] = '\0';
  string[0] = '\a';
  string[1] = '\0';
  string[2] = '\0';
  string[3] = '\0';
  string[4] = '\0';
  string[5] = '\0';
  string[6] = '\0';
  string[7] = '\0';
  char_mask_get_bits_raised_pre(words);
  iVar38 = bcmp(&head,words,0x60);
  cVar3 = iVar38 != 0;
  if ((bool)cVar3) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x255,"memcmp(expected1, bits, MASK_BITS) == 0");
  }
  string[8] = '\0';
  string[9] = '\0';
  string[10] = '\0';
  string[0xb] = '\0';
  string[0xc] = '\0';
  string[0xd] = '\0';
  string[0xe] = '\0';
  string[0xf] = '\0';
  string[0x50] = '\0';
  string[0x51] = '\0';
  string[0x52] = '\0';
  string[0x53] = '\0';
  string[0x54] = '\0';
  string[0x55] = '\0';
  string[0x56] = '\0';
  string[0x57] = '\0';
  string[0x58] = '\0';
  string[0x59] = '\0';
  string[0x5a] = '\0';
  string[0x5b] = '\0';
  string[0x5c] = '\0';
  string[0x5d] = '\0';
  string[0x5e] = '\0';
  string[0x5f] = '\0';
  string[0x40] = '\0';
  string[0x41] = '\0';
  string[0x42] = '\0';
  string[0x43] = '\0';
  string[0x44] = '\0';
  string[0x45] = '\0';
  string[0x46] = '\0';
  string[0x47] = '\0';
  string[0x48] = '\0';
  string[0x49] = '\0';
  string[0x4a] = '\0';
  string[0x4b] = '\0';
  string[0x4c] = '\0';
  string[0x4d] = '\0';
  string[0x4e] = '\0';
  string[0x4f] = '\0';
  string[0x30] = '\0';
  string[0x31] = '\0';
  string[0x32] = '\0';
  string[0x33] = '\0';
  string[0x34] = '\0';
  string[0x35] = '\0';
  string[0x36] = '\0';
  string[0x37] = '\0';
  string[0x38] = '\0';
  string[0x39] = '\0';
  string[0x3a] = '\0';
  string[0x3b] = '\0';
  string[0x3c] = '\0';
  string[0x3d] = '\0';
  string[0x3e] = '\0';
  string[0x3f] = '\0';
  string[0x20] = '\0';
  string[0x21] = '\0';
  string[0x22] = '\0';
  string[0x23] = '\0';
  string[0x24] = '\0';
  string[0x25] = '\0';
  string[0x26] = '\0';
  string[0x27] = '\0';
  string[0x28] = '\0';
  string[0x29] = '\0';
  string[0x2a] = '\0';
  string[0x2b] = '\0';
  string[0x2c] = '\0';
  string[0x2d] = '\0';
  string[0x2e] = '\0';
  string[0x2f] = '\0';
  string[0x10] = '\0';
  string[0x11] = '\0';
  string[0x12] = '\0';
  string[0x13] = '\0';
  string[0x14] = '\0';
  string[0x15] = '\0';
  string[0x16] = '\0';
  string[0x17] = '\0';
  string[0x18] = '\0';
  string[0x19] = '\0';
  string[0x1a] = '\0';
  string[0x1b] = '\0';
  string[0x1c] = '\0';
  string[0x1d] = '\0';
  string[0x1e] = '\0';
  string[0x1f] = '\0';
  words[0][0] = '\0';
  words[0][1] = '\0';
  words[0][2] = '\0';
  words[0][3] = '\0';
  words[0][4] = '\0';
  words[0][5] = '\0';
  words[0][6] = '\0';
  words[0][7] = '\0';
  words[0][8] = '\0';
  words[0][9] = '\0';
  words[0][10] = '\0';
  words[0][0xb] = '\0';
  words[0][0xc] = '\0';
  words[0][0xd] = '\0';
  words[0][0xe] = '\0';
  words[0][0xf] = '\0';
  words[0][0x10] = '\0';
  words[0][0x11] = '\0';
  words[0][0x12] = '\0';
  words[0][0x13] = '\0';
  words[1][0] = '\0';
  words[1][1] = '\0';
  words[1][2] = '\0';
  words[1][3] = '\0';
  words[1][4] = '\0';
  words[1][5] = '\0';
  words[1][6] = '\0';
  words[1][7] = '\0';
  words[1][8] = '\0';
  words[1][9] = '\0';
  words[1][10] = '\0';
  words[1][0xb] = '\0';
  words[1][0xc] = '\0';
  words[1][0xd] = '\0';
  words[1][0xe] = '\0';
  words[1][0xf] = '\0';
  words[1][0x10] = '\0';
  words[1][0x11] = '\0';
  words[1][0x12] = '\0';
  words[1][0x13] = '\0';
  words[2][0] = '\0';
  words[2][1] = '\0';
  words[2][2] = '\0';
  words[2][3] = '\0';
  words[2][4] = '\0';
  words[2][5] = '\0';
  words[2][6] = '\0';
  words[2][7] = '\0';
  words[2][8] = '\0';
  words[2][9] = '\0';
  words[2][10] = '\0';
  words[2][0xb] = '\0';
  words[2][0xc] = '\0';
  words[2][0xd] = '\0';
  words[2][0xe] = '\0';
  words[2][0xf] = '\0';
  words[2][0x10] = '\0';
  words[2][0x11] = '\0';
  words[2][0x12] = '\0';
  words[2][0x13] = '\0';
  words[3][0] = '\0';
  words[3][1] = '\0';
  words[3][2] = '\0';
  words[3][3] = '\0';
  words[3][4] = '\0';
  words[3][5] = '\0';
  words[3][6] = '\0';
  words[3][7] = '\0';
  words[3][8] = '\0';
  words[3][9] = '\0';
  words[3][10] = '\0';
  words[3][0xb] = '\0';
  words[3][0xc] = '\0';
  words[3][0xd] = '\0';
  words[3][0xe] = '\0';
  words[3][0xf] = '\0';
  words[3][0x10] = '\0';
  words[3][0x11] = '\0';
  words[3][0x12] = '\0';
  words[3][0x13] = '\0';
  words[4][0] = '\0';
  words[4][1] = '\0';
  words[4][2] = '\0';
  words[4][3] = '\0';
  words[4][4] = '\0';
  words[4][5] = '\0';
  words[4][6] = '\0';
  words[4][7] = '\0';
  words[4][8] = '\0';
  words[4][9] = '\0';
  words[4][10] = '\0';
  words[4][0xb] = '\0';
  words[4][0xc] = '\0';
  words[4][0xd] = '\0';
  words[4][0xe] = '\0';
  words[4][0xf] = '\0';
  string[0] = '\0';
  string[1] = '\x02';
  string[2] = '\b';
  string[3] = ' ';
  string[4] = '\0';
  string[5] = '\0';
  string[6] = '\0';
  string[7] = '\0';
  char_mask_get_bits_raised_pre(words);
  iVar38 = bcmp(expected2,words,0x60);
  if (iVar38 != 0) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x25e,"memcmp(expected2, bits, MASK_BITS) == 0");
    cVar3 = cVar3 + '\x01';
  }
  string[8] = '\0';
  string[9] = '\0';
  string[10] = '\0';
  string[0xb] = '\0';
  string[0xc] = '\0';
  string[0xd] = '\0';
  string[0xe] = '\0';
  string[0xf] = '\0';
  string[0x50] = '\0';
  string[0x51] = '\0';
  string[0x52] = '\0';
  string[0x53] = '\0';
  string[0x54] = '\0';
  string[0x55] = '\0';
  string[0x56] = '\0';
  string[0x57] = '\0';
  string[0x58] = '\0';
  string[0x59] = '\0';
  string[0x5a] = '\0';
  string[0x5b] = '\0';
  string[0x5c] = '\0';
  string[0x5d] = '\0';
  string[0x5e] = '\0';
  string[0x5f] = '\0';
  string[0x40] = '\0';
  string[0x41] = '\0';
  string[0x42] = '\0';
  string[0x43] = '\0';
  string[0x44] = '\0';
  string[0x45] = '\0';
  string[0x46] = '\0';
  string[0x47] = '\0';
  string[0x48] = '\0';
  string[0x49] = '\0';
  string[0x4a] = '\0';
  string[0x4b] = '\0';
  string[0x4c] = '\0';
  string[0x4d] = '\0';
  string[0x4e] = '\0';
  string[0x4f] = '\0';
  string[0x30] = '\0';
  string[0x31] = '\0';
  string[0x32] = '\0';
  string[0x33] = '\0';
  string[0x34] = '\0';
  string[0x35] = '\0';
  string[0x36] = '\0';
  string[0x37] = '\0';
  string[0x38] = '\0';
  string[0x39] = '\0';
  string[0x3a] = '\0';
  string[0x3b] = '\0';
  string[0x3c] = '\0';
  string[0x3d] = '\0';
  string[0x3e] = '\0';
  string[0x3f] = '\0';
  string[0x20] = '\0';
  string[0x21] = '\0';
  string[0x22] = '\0';
  string[0x23] = '\0';
  string[0x24] = '\0';
  string[0x25] = '\0';
  string[0x26] = '\0';
  string[0x27] = '\0';
  string[0x28] = '\0';
  string[0x29] = '\0';
  string[0x2a] = '\0';
  string[0x2b] = '\0';
  string[0x2c] = '\0';
  string[0x2d] = '\0';
  string[0x2e] = '\0';
  string[0x2f] = '\0';
  string[0x10] = '\0';
  string[0x11] = '\0';
  string[0x12] = '\0';
  string[0x13] = '\0';
  string[0x14] = '\0';
  string[0x15] = '\0';
  string[0x16] = '\0';
  string[0x17] = '\0';
  string[0x18] = '\0';
  string[0x19] = '\0';
  string[0x1a] = '\0';
  string[0x1b] = '\0';
  string[0x1c] = '\0';
  string[0x1d] = '\0';
  string[0x1e] = '\0';
  string[0x1f] = '\0';
  words[0][0] = '\0';
  words[0][1] = '\0';
  words[0][2] = '\0';
  words[0][3] = '\0';
  words[0][4] = '\0';
  words[0][5] = '\0';
  words[0][6] = '\0';
  words[0][7] = '\0';
  words[0][8] = '\0';
  words[0][9] = '\0';
  words[0][10] = '\0';
  words[0][0xb] = '\0';
  words[0][0xc] = '\0';
  words[0][0xd] = '\0';
  words[0][0xe] = '\0';
  words[0][0xf] = '\0';
  words[0][0x10] = '\0';
  words[0][0x11] = '\0';
  words[0][0x12] = '\0';
  words[0][0x13] = '\0';
  words[1][0] = '\0';
  words[1][1] = '\0';
  words[1][2] = '\0';
  words[1][3] = '\0';
  words[1][4] = '\0';
  words[1][5] = '\0';
  words[1][6] = '\0';
  words[1][7] = '\0';
  words[1][8] = '\0';
  words[1][9] = '\0';
  words[1][10] = '\0';
  words[1][0xb] = '\0';
  words[1][0xc] = '\0';
  words[1][0xd] = '\0';
  words[1][0xe] = '\0';
  words[1][0xf] = '\0';
  words[1][0x10] = '\0';
  words[1][0x11] = '\0';
  words[1][0x12] = '\0';
  words[1][0x13] = '\0';
  words[2][0] = '\0';
  words[2][1] = '\0';
  words[2][2] = '\0';
  words[2][3] = '\0';
  words[2][4] = '\0';
  words[2][5] = '\0';
  words[2][6] = '\0';
  words[2][7] = '\0';
  words[2][8] = '\0';
  words[2][9] = '\0';
  words[2][10] = '\0';
  words[2][0xb] = '\0';
  words[2][0xc] = '\0';
  words[2][0xd] = '\0';
  words[2][0xe] = '\0';
  words[2][0xf] = '\0';
  words[2][0x10] = '\0';
  words[2][0x11] = '\0';
  words[2][0x12] = '\0';
  words[2][0x13] = '\0';
  words[3][0] = '\0';
  words[3][1] = '\0';
  words[3][2] = '\0';
  words[3][3] = '\0';
  words[3][4] = '\0';
  words[3][5] = '\0';
  words[3][6] = '\0';
  words[3][7] = '\0';
  words[3][8] = '\0';
  words[3][9] = '\0';
  words[3][10] = '\0';
  words[3][0xb] = '\0';
  words[3][0xc] = '\0';
  words[3][0xd] = '\0';
  words[3][0xe] = '\0';
  words[3][0xf] = '\0';
  words[3][0x10] = '\0';
  words[3][0x11] = '\0';
  words[3][0x12] = '\0';
  words[3][0x13] = '\0';
  words[4][0] = '\0';
  words[4][1] = '\0';
  words[4][2] = '\0';
  words[4][3] = '\0';
  words[4][4] = '\0';
  words[4][5] = '\0';
  words[4][6] = '\0';
  words[4][7] = '\0';
  words[4][8] = '\0';
  words[4][9] = '\0';
  words[4][10] = '\0';
  words[4][0xb] = '\0';
  words[4][0xc] = '\0';
  words[4][0xd] = '\0';
  words[4][0xe] = '\0';
  words[4][0xf] = '\0';
  string[0] = '\0';
  string[1] = '\x04';
  string[2] = ' ';
  string[3] = '\0';
  string[4] = '\x01';
  string[5] = '\0';
  string[6] = '\0';
  string[7] = '\0';
  char_mask_get_bits_raised_pre(words);
  iVar38 = bcmp(word,words,0x60);
  if (iVar38 != 0) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x267,"memcmp(expected3, bits, MASK_BITS) == 0");
    cVar3 = '\x01';
  }
  string[0x50] = '\0';
  string[0x51] = '\0';
  string[0x52] = '\0';
  string[0x53] = '\0';
  string[0x54] = '\0';
  string[0x55] = '\0';
  string[0x56] = '\0';
  string[0x57] = '\0';
  string[0x58] = '\0';
  string[0x59] = '\0';
  string[0x5a] = '\0';
  string[0x5b] = '\0';
  string[0x5c] = '\0';
  string[0x5d] = '\0';
  string[0x5e] = '\0';
  string[0x5f] = '\0';
  string[0x40] = '\0';
  string[0x41] = '\0';
  string[0x42] = '\0';
  string[0x43] = '\0';
  string[0x44] = '\0';
  string[0x45] = '\0';
  string[0x46] = '\0';
  string[0x47] = '\0';
  string[0x48] = '\0';
  string[0x49] = '\0';
  string[0x4a] = '\0';
  string[0x4b] = '\0';
  string[0x4c] = '\0';
  string[0x4d] = '\0';
  string[0x4e] = '\0';
  string[0x4f] = '\0';
  string[0x30] = '\0';
  string[0x31] = '\0';
  string[0x32] = '\0';
  string[0x33] = '\0';
  string[0x34] = '\0';
  string[0x35] = '\0';
  string[0x36] = '\0';
  string[0x37] = '\0';
  string[0x38] = '\0';
  string[0x39] = '\0';
  string[0x3a] = '\0';
  string[0x3b] = '\0';
  string[0x3c] = '\0';
  string[0x3d] = '\0';
  string[0x3e] = '\0';
  string[0x3f] = '\0';
  string[0x20] = '\0';
  string[0x21] = '\0';
  string[0x22] = '\0';
  string[0x23] = '\0';
  string[0x24] = '\0';
  string[0x25] = '\0';
  string[0x26] = '\0';
  string[0x27] = '\0';
  string[0x28] = '\0';
  string[0x29] = '\0';
  string[0x2a] = '\0';
  string[0x2b] = '\0';
  string[0x2c] = '\0';
  string[0x2d] = '\0';
  string[0x2e] = '\0';
  string[0x2f] = '\0';
  string[0x10] = '\0';
  string[0x11] = '\0';
  string[0x12] = '\0';
  string[0x13] = '\0';
  string[0x14] = '\0';
  string[0x15] = '\0';
  string[0x16] = '\0';
  string[0x17] = '\0';
  string[0x18] = '\0';
  string[0x19] = '\0';
  string[0x1a] = '\0';
  string[0x1b] = '\0';
  string[0x1c] = '\0';
  string[0x1d] = '\0';
  string[0x1e] = '\0';
  string[0x1f] = '\0';
  words[0][0] = '\0';
  words[0][1] = '\0';
  words[0][2] = '\0';
  words[0][3] = '\0';
  words[0][4] = '\0';
  words[0][5] = '\0';
  words[0][6] = '\0';
  words[0][7] = '\0';
  words[0][8] = '\0';
  words[0][9] = '\0';
  words[0][10] = '\0';
  words[0][0xb] = '\0';
  words[0][0xc] = '\0';
  words[0][0xd] = '\0';
  words[0][0xe] = '\0';
  words[0][0xf] = '\0';
  words[0][0x10] = '\0';
  words[0][0x11] = '\0';
  words[0][0x12] = '\0';
  words[0][0x13] = '\0';
  words[1][0] = '\0';
  words[1][1] = '\0';
  words[1][2] = '\0';
  words[1][3] = '\0';
  words[1][4] = '\0';
  words[1][5] = '\0';
  words[1][6] = '\0';
  words[1][7] = '\0';
  words[1][8] = '\0';
  words[1][9] = '\0';
  words[1][10] = '\0';
  words[1][0xb] = '\0';
  words[1][0xc] = '\0';
  words[1][0xd] = '\0';
  words[1][0xe] = '\0';
  words[1][0xf] = '\0';
  words[1][0x10] = '\0';
  words[1][0x11] = '\0';
  words[1][0x12] = '\0';
  words[1][0x13] = '\0';
  words[2][0] = '\0';
  words[2][1] = '\0';
  words[2][2] = '\0';
  words[2][3] = '\0';
  words[2][4] = '\0';
  words[2][5] = '\0';
  words[2][6] = '\0';
  words[2][7] = '\0';
  words[2][8] = '\0';
  words[2][9] = '\0';
  words[2][10] = '\0';
  words[2][0xb] = '\0';
  words[2][0xc] = '\0';
  words[2][0xd] = '\0';
  words[2][0xe] = '\0';
  words[2][0xf] = '\0';
  words[2][0x10] = '\0';
  words[2][0x11] = '\0';
  words[2][0x12] = '\0';
  words[2][0x13] = '\0';
  words[3][0] = '\0';
  words[3][1] = '\0';
  words[3][2] = '\0';
  words[3][3] = '\0';
  words[3][4] = '\0';
  words[3][5] = '\0';
  words[3][6] = '\0';
  words[3][7] = '\0';
  words[3][8] = '\0';
  words[3][9] = '\0';
  words[3][10] = '\0';
  words[3][0xb] = '\0';
  words[3][0xc] = '\0';
  words[3][0xd] = '\0';
  words[3][0xe] = '\0';
  words[3][0xf] = '\0';
  words[3][0x10] = '\0';
  words[3][0x11] = '\0';
  words[3][0x12] = '\0';
  words[3][0x13] = '\0';
  words[4][0] = '\0';
  words[4][1] = '\0';
  words[4][2] = '\0';
  words[4][3] = '\0';
  words[4][4] = '\0';
  words[4][5] = '\0';
  words[4][6] = '\0';
  words[4][7] = '\0';
  words[4][8] = '\0';
  words[4][9] = '\0';
  words[4][10] = '\0';
  words[4][0xb] = '\0';
  words[4][0xc] = '\0';
  words[4][0xd] = '\0';
  words[4][0xe] = '\0';
  words[4][0xf] = '\0';
  string[0] = 0x81;
  string[1] = 0x81;
  string[2] = 0x81;
  string[3] = 0x81;
  string[4] = 0x81;
  string[5] = 0x81;
  string[6] = 0x81;
  string[7] = 0x81;
  string[8] = 0x81;
  string[9] = 0x81;
  string[10] = 0x81;
  string[0xb] = 0x81;
  string[0xc] = '\0';
  string[0xd] = '\0';
  string[0xe] = '\0';
  string[0xf] = '\0';
  char_mask_get_bits_raised_pre(words);
  iVar38 = bcmp(&DAT_00106f00,words,0x60);
  if (iVar38 == 0) {
    if (cVar3 == '\0') {
      piVar39 = &tests_passed;
    }
  }
  else {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x279,"memcmp(expected4, bits, MASK_BITS) == 0");
  }
  *piVar39 = *piVar39 + 1;
  pvVar30 = (void *)yatrie_new(500,500,100);
  iVar38 = yatrie_char_add(0,0x5f,pvVar30);
  cVar3 = iVar38 != 1;
  if ((bool)cVar3) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x1bf,"node_id_inserted == 1");
  }
  iVar38 = yatrie_char_add(0,0x5f,pvVar30);
  if (iVar38 != 1) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x1c3,"node_id_inserted == 1");
    cVar3 = cVar3 + '\x01';
  }
  iVar38 = yatrie_char_add(1,2,pvVar30);
  if (iVar38 != 2) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x1c7,"node_id_inserted == 2");
    cVar3 = cVar3 + '\x01';
  }
  iVar38 = yatrie_char_add(2,0x32,pvVar30);
  if (iVar38 != 3) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x1cb,"node_id_inserted == 3");
    cVar3 = '\x01';
  }
  free(pvVar30);
  piVar19 = &tests_failed;
  if (cVar3 == '\0') {
    piVar19 = &tests_passed;
  }
  *piVar19 = *piVar19 + 1;
  puVar40 = &DAT_00106f60;
  pauVar36 = words;
  for (lVar20 = 0x4d; lVar20 != 0; lVar20 = lVar20 + -1) {
    (*pauVar36)[0] = *puVar40;
    puVar40 = puVar40 + (ulong)bVar44 * -2 + 1;
    pauVar36 = (uint8_t (*) [20])((long)pauVar36 + (ulong)bVar44 * -2 + 1);
  }
  memset(string,0,0x100);
  encode_string(string,words);
  iVar38 = 0;
  for (lVar20 = 0; lVar20 != 0x2b; lVar20 = lVar20 + 1) {
    if (lVar20 + 2U != (ulong)string[lVar20]) {
      printf("assert failed: %s:%i expression: %s\n",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
             ,0xbe,"dst[i] == i + 2");
      iVar38 = iVar38 + 1;
    }
  }
  piVar19 = &tests_failed;
  if (iVar38 == 0) {
    piVar19 = &tests_passed;
  }
  *piVar19 = *piVar19 + 1;
  puVar22 = (undefined8 *)yatrie_new(5000000,5000000,200);
  puts(
      "COMPLEX TEST\nThis test will create trie from a dictionary file, \nthen compare each word leaf node id with returned \nnode id by the yatrie_get_id() function \n"
      );
  cVar26 = 0;
  printf("Trie settings:\nnode size:       %u bytes\n");
  printf("trie size:       %u kb\n");
  printf("trie size nodes: %u kb\n");
  printf("trie size refs:  %u kb\n\n");
  memset(string,0,0x200);
  pvVar30 = calloc(6000000,4);
  __s2 = calloc(6000000,4);
  pFVar23 = fopen((char *)dic_path,"r");
  local_51d8 = 0;
  if (pFVar23 == (FILE *)0x0) {
LAB_001048b5:
    iVar38 = bcmp(pvVar30,__s2,24000000);
    if (iVar38 != 0) {
      printf("assert failed: %s:%i expression: %s\n",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
             ,0x3a4,"memcmp(added_nodes, getted_nodes, MAX_NODES * 4) == 0");
      local_51a0 = &tests_failed;
    }
    printf("trie creation time: %fs\n",SUB84((double)((float)(cVar26 - local_51d8) / 1e+06),0));
    iVar38 = 0;
    printf("nodes created: %d\nreferences created: %d\n",(ulong)*(uint *)*puVar22,
           (ulong)*(uint *)puVar22[1]);
    free(pvVar30);
    free(__s2);
    yatrie_free(puVar22);
    *local_51a0 = *local_51a0 + 1;
    puts("\n\nANOTHER NODE TRAVERSE");
    uVar18 = yatrie_new(5000000,5000000,200);
    memset(string,0,0x200);
    pFVar23 = fopen((char *)dic_path,"r");
    if (pFVar23 == (FILE *)0x0) {
      fVar45 = 0.0;
    }
    else {
      cVar26 = clock();
      while( true ) {
        while ((iVar5 = getc(pFVar23), iVar5 == 10 || (iVar5 == 0xd))) {
          iVar38 = 0;
          yatrie_add(string,0,uVar18);
          memset(string,0,0x200);
        }
        if (iVar5 == -1) break;
        string[iVar38] = (uint8_t)iVar5;
        iVar38 = iVar38 + 1;
      }
      cVar27 = clock();
      fclose(pFVar23);
      fVar45 = (float)(cVar27 - cVar26);
    }
    printf("Trie creation time: %fs\n",SUB84((double)(fVar45 / 1e+06),0));
    puts("TRAVERSE ALL NODES STARTING FROM \'af\' NODE\n");
    uVar24 = (ulong)_word >> 0x10;
    _word = CONCAT62((uint6)uVar24 & 0xffffffffff00,0x6661);
    iVar38 = yatrie_get_id(word,0,uVar18);
    if (iVar38 == 0) {
      printf("word: %s not found in the trie. Test aborted!\n",word);
    }
    else {
      puVar28 = (uint *)calloc(1,0x2714);
      expected2[0x50] = '\0';
      expected2[0x51] = '\0';
      expected2[0x52] = '\0';
      expected2[0x53] = '\0';
      expected2[0x54] = '\0';
      expected2[0x55] = '\0';
      expected2[0x56] = '\0';
      expected2[0x57] = '\0';
      expected2[0x58] = '\0';
      expected2[0x59] = '\0';
      expected2[0x5a] = '\0';
      expected2[0x5b] = '\0';
      expected2[0x5c] = '\0';
      expected2[0x5d] = '\0';
      expected2[0x5e] = '\0';
      expected2[0x5f] = '\0';
      expected2[0x40] = '\0';
      expected2[0x41] = '\0';
      expected2[0x42] = '\0';
      expected2[0x43] = '\0';
      expected2[0x44] = '\0';
      expected2[0x45] = '\0';
      expected2[0x46] = '\0';
      expected2[0x47] = '\0';
      expected2[0x48] = '\0';
      expected2[0x49] = '\0';
      expected2[0x4a] = '\0';
      expected2[0x4b] = '\0';
      expected2[0x4c] = '\0';
      expected2[0x4d] = '\0';
      expected2[0x4e] = '\0';
      expected2[0x4f] = '\0';
      expected2[0x30] = '\0';
      expected2[0x31] = '\0';
      expected2[0x32] = '\0';
      expected2[0x33] = '\0';
      expected2[0x34] = '\0';
      expected2[0x35] = '\0';
      expected2[0x36] = '\0';
      expected2[0x37] = '\0';
      expected2[0x38] = '\0';
      expected2[0x39] = '\0';
      expected2[0x3a] = '\0';
      expected2[0x3b] = '\0';
      expected2[0x3c] = '\0';
      expected2[0x3d] = '\0';
      expected2[0x3e] = '\0';
      expected2[0x3f] = '\0';
      expected2[0x20] = '\0';
      expected2[0x21] = '\0';
      expected2[0x22] = '\0';
      expected2[0x23] = '\0';
      expected2[0x24] = '\0';
      expected2[0x25] = '\0';
      expected2[0x26] = '\0';
      expected2[0x27] = '\0';
      expected2[0x28] = '\0';
      expected2[0x29] = '\0';
      expected2[0x2a] = '\0';
      expected2[0x2b] = '\0';
      expected2[0x2c] = '\0';
      expected2[0x2d] = '\0';
      expected2[0x2e] = '\0';
      expected2[0x2f] = '\0';
      expected2[0x10] = '\0';
      expected2[0x11] = '\0';
      expected2[0x12] = '\0';
      expected2[0x13] = '\0';
      expected2[0x14] = '\0';
      expected2[0x15] = '\0';
      expected2[0x16] = '\0';
      expected2[0x17] = '\0';
      expected2[0x18] = '\0';
      expected2[0x19] = '\0';
      expected2[0x1a] = '\0';
      expected2[0x1b] = '\0';
      expected2[0x1c] = '\0';
      expected2[0x1d] = '\0';
      expected2[0x1e] = '\0';
      expected2[0x1f] = '\0';
      expected2[0] = '\0';
      expected2[1] = '\0';
      expected2[2] = '\0';
      expected2[3] = '\0';
      expected2[4] = '\0';
      expected2[5] = '\0';
      expected2[6] = '\0';
      expected2[7] = '\0';
      expected2[8] = '\0';
      expected2[9] = '\0';
      expected2[10] = '\0';
      expected2[0xb] = '\0';
      expected2[0xc] = '\0';
      expected2[0xd] = '\0';
      expected2[0xe] = '\0';
      expected2[0xf] = '\0';
      encode_string(expected2,word);
      uVar1 = expected2._0_8_;
      head.letters[2] = '\0';
      head.letters[3] = '\0';
      head.letters[4] = '\0';
      head.letters[5] = '\0';
      head.letters[6] = '\0';
      head.letters[7] = '\0';
      head.letters[8] = '\0';
      head.letters[9] = '\0';
      head.letters[10] = '\0';
      head.letters[0xb] = '\0';
      head.letters[0xc] = '\0';
      head.letters[0xd] = '\0';
      head.letters[0xe] = '\0';
      head.letters[0xf] = '\0';
      head.letters[0x50] = '\0';
      head.letters[0x51] = '\0';
      head.letters[0x52] = '\0';
      head.letters[0x53] = '\0';
      head.letters[0x54] = '\0';
      head.letters[0x55] = '\0';
      head.letters[0x56] = '\0';
      head.letters[0x57] = '\0';
      head.letters[0x58] = '\0';
      head.letters[0x59] = '\0';
      head.letters[0x5a] = '\0';
      head.letters[0x5b] = '\0';
      head.letters[0x5c] = '\0';
      head.letters[0x5d] = '\0';
      head.letters[0x5e] = '\0';
      head.letters[0x5f] = '\0';
      head.letters[0x40] = '\0';
      head.letters[0x41] = '\0';
      head.letters[0x42] = '\0';
      head.letters[0x43] = '\0';
      head.letters[0x44] = '\0';
      head.letters[0x45] = '\0';
      head.letters[0x46] = '\0';
      head.letters[0x47] = '\0';
      head.letters[0x48] = '\0';
      head.letters[0x49] = '\0';
      head.letters[0x4a] = '\0';
      head.letters[0x4b] = '\0';
      head.letters[0x4c] = '\0';
      head.letters[0x4d] = '\0';
      head.letters[0x4e] = '\0';
      head.letters[0x4f] = '\0';
      head.letters[0x30] = '\0';
      head.letters[0x31] = '\0';
      head.letters[0x32] = '\0';
      head.letters[0x33] = '\0';
      head.letters[0x34] = '\0';
      head.letters[0x35] = '\0';
      head.letters[0x36] = '\0';
      head.letters[0x37] = '\0';
      head.letters[0x38] = '\0';
      head.letters[0x39] = '\0';
      head.letters[0x3a] = '\0';
      head.letters[0x3b] = '\0';
      head.letters[0x3c] = '\0';
      head.letters[0x3d] = '\0';
      head.letters[0x3e] = '\0';
      head.letters[0x3f] = '\0';
      head.letters[0x20] = '\0';
      head.letters[0x21] = '\0';
      head.letters[0x22] = '\0';
      head.letters[0x23] = '\0';
      head.letters[0x24] = '\0';
      head.letters[0x25] = '\0';
      head.letters[0x26] = '\0';
      head.letters[0x27] = '\0';
      head.letters[0x28] = '\0';
      head.letters[0x29] = '\0';
      head.letters[0x2a] = '\0';
      head.letters[0x2b] = '\0';
      head.letters[0x2c] = '\0';
      head.letters[0x2d] = '\0';
      head.letters[0x2e] = '\0';
      head.letters[0x2f] = '\0';
      head.letters[0x60] = '\0';
      head.letters[0x61] = '\0';
      head.letters[0x62] = '\0';
      head.letters[99] = '\0';
      head.letters[0x10] = '\0';
      head.letters[0x11] = '\0';
      head.letters[0x12] = '\0';
      head.letters[0x13] = '\0';
      head.letters[0x14] = '\0';
      head.letters[0x15] = '\0';
      head.letters[0x16] = '\0';
      head.letters[0x17] = '\0';
      head.letters[0x18] = '\0';
      head.letters[0x19] = '\0';
      head.letters[0x1a] = '\0';
      head.letters[0x1b] = '\0';
      head.letters[0x1c] = '\0';
      head.letters[0x1d] = '\0';
      head.letters[0x1e] = '\0';
      head.letters[0x1f] = '\0';
      head.length._0_2_ = 2;
      head.length._2_1_ = 0;
      head.length._3_1_ = 0;
      head.letters[0] = expected2[0];
      head.letters[1] = expected2[1];
      expected2._0_8_ = uVar1;
      yatrie_node_traverse(puVar28,iVar38,&head,uVar18);
      puVar31 = puVar28 + 1;
      for (uVar24 = 0; uVar24 < *puVar28; uVar24 = uVar24 + 1) {
        memset(words,0,0x100);
        decode_string(words,puVar31);
        printf("returned: %s\n");
        puVar31 = puVar31 + 0x19;
      }
      puts("\n");
      yatrie_free(uVar18);
      free(puVar28);
    }
    tests_passed = tests_passed + 1;
    return tests_failed;
  }
  local_51d8 = clock();
  puVar40 = string;
  uVar32 = 0;
  while( true ) {
    while ((iVar38 = getc(pFVar23), iVar38 == 0xd || (iVar38 == 10))) {
      uVar33 = uVar32 + 1;
      uVar17 = yatrie_add(string,0,puVar22);
      *(undefined4 *)((long)pvVar30 + (ulong)uVar32 * 4 + 4) = uVar17;
      memset(string,0,0x200);
      puVar40 = string;
      uVar32 = uVar33;
      if ((uVar33 & 0x3ffff) == 0) {
        printf("a:%d\n");
      }
    }
    if (iVar38 == -1) break;
    *puVar40 = (uint8_t)iVar38;
    puVar40 = puVar40 + 1;
  }
  cVar26 = clock();
  rewind(pFVar23);
  uVar32 = 0;
  do {
    uVar24 = (ulong)uVar32;
    puVar40 = string;
    while ((iVar38 = getc(pFVar23), iVar38 != 0xd && (iVar38 != 10))) {
      if (iVar38 == -1) {
        fclose(pFVar23);
        goto LAB_001048b5;
      }
      *puVar40 = (uint8_t)iVar38;
      puVar40 = puVar40 + 1;
    }
    uVar32 = uVar32 + 1;
    uVar17 = yatrie_get_id(string,0,puVar22);
    *(undefined4 *)((long)__s2 + uVar24 * 4 + 4) = uVar17;
    memset(string,0,0x200);
    if ((uVar32 & 0x3ffff) == 0) {
      printf("g:%d\n");
    }
  } while( true );
}

Assistant:

static int all_tests() {
    U_RUN(test_foo);

    U_RUN(test_yatrie_get_word_nodes);
    U_RUN(test_yatrie_new);
    U_RUN(test_load_missed_file);
    U_RUN(test_bit_int32_count);
    U_RUN(test_bit_get);
    U_RUN(test_bit_set);
    U_RUN(test_bit_array_set);
    U_RUN(test_bit_array_get);
    U_RUN(test_bit_count);
    U_RUN(test_char_bit_count);
    U_RUN(test_char_mask_get_bits_raised);
    U_RUN(test_char_mask_get_bits_raised_pre);
    U_RUN(test_trie_save_load);
    U_RUN(test_node_traverse_decode);
    U_RUN(test_decode_string);
    U_RUN(test_node_insert_ref);
    U_RUN(test_trie_get_id);
    U_RUN(test_node_traverse);
    U_RUN(test_trie_add);
    U_RUN(test_node_get_children);
    U_RUN(test_mask_get_bits_raised_pre);
    U_RUN(test_trie_char_add);
    U_RUN(test_transcode_string);
    U_RUN(complex_test);
    U_RUN(another_node_traverse);

    return tests_failed;
}